

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  code *pcVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  undefined8 *puVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  ushort uVar22;
  size_t sVar23;
  Geometry *pGVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  RTCFilterFunctionN p_Var30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  byte bVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  size_t sVar50;
  undefined4 uVar51;
  AABBNodeMB4D *node1;
  ulong uVar52;
  RTCIntersectArguments *pRVar53;
  uint uVar54;
  int iVar55;
  size_t sVar56;
  ulong uVar57;
  long lVar58;
  NodeRef root;
  ulong uVar59;
  long lVar60;
  code *pcVar61;
  ulong uVar62;
  RayK<4> *in_R9;
  long lVar63;
  long lVar64;
  NodeRef *pNVar65;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar66;
  bool bVar67;
  float fVar68;
  float fVar96;
  float fVar97;
  vint4 ai;
  undefined1 auVar69 [16];
  float fVar98;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  byte bVar99;
  float fVar100;
  byte bVar119;
  byte bVar120;
  byte bVar122;
  byte bVar123;
  byte bVar124;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  byte bVar121;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar142;
  float fVar143;
  float fVar148;
  float fVar150;
  vint4 ai_1;
  undefined1 auVar144 [16];
  float fVar152;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar149;
  float fVar151;
  undefined1 auVar147 [16];
  float fVar153;
  float fVar154;
  float fVar163;
  float fVar164;
  vint4 ai_3;
  float fVar165;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar166;
  float fVar173;
  float fVar174;
  vint4 bi_3;
  float fVar175;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar176;
  float fVar183;
  float fVar184;
  vint4 bi;
  undefined1 auVar177 [16];
  float fVar185;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar186;
  float fVar194;
  float fVar195;
  vint4 bi_1;
  float fVar196;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  uint uVar202;
  vint4 ai_2;
  undefined1 auVar197 [16];
  uint uVar203;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  uint uVar204;
  float fVar205;
  uint uVar208;
  uint uVar210;
  vint4 bi_2;
  uint uVar212;
  undefined1 auVar206 [16];
  float fVar209;
  float fVar211;
  float fVar213;
  undefined1 auVar207 [16];
  float fVar214;
  float fVar215;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar216 [16];
  uint uVar226;
  uint uVar227;
  uint uVar228;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar229;
  float fVar230;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar238;
  float fVar239;
  int iVar240;
  float fVar241;
  float fVar242;
  int iVar243;
  float fVar244;
  float fVar245;
  int iVar246;
  float fVar247;
  float fVar248;
  int iVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar256;
  float fVar258;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar254;
  float fVar257;
  float fVar259;
  float fVar260;
  undefined1 auVar255 [16];
  UVIdentity<4> mapUV;
  undefined1 local_1c78 [8];
  float fStack_1c70;
  float fStack_1c6c;
  undefined1 local_1c58 [8];
  float fStack_1c50;
  float fStack_1c4c;
  Precalculations pre;
  float old_t;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float old_t_1;
  undefined1 local_1bf8 [16];
  uint local_1be4;
  uint local_1be0;
  uint local_1bdc;
  undefined1 local_1bd8 [8];
  float fStack_1bd0;
  float fStack_1bcc;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 local_1b68;
  float fStack_1b50;
  float fStack_1b4c;
  float local_1b48 [4];
  float local_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  undefined1 local_1b28 [16];
  UVIdentity<4> *local_1b18;
  undefined1 local_1b08 [16];
  undefined1 local_1af8 [16];
  undefined1 local_1ae8 [16];
  undefined1 local_1ad8 [8];
  float fStack_1ad0;
  float fStack_1acc;
  undefined1 local_1ac8 [16];
  undefined1 local_1ab8 [16];
  undefined1 local_1aa8 [16];
  undefined8 local_1a98;
  float fStack_1a90;
  float fStack_1a8c;
  undefined1 local_1a88 [8];
  float fStack_1a80;
  float fStack_1a7c;
  undefined1 local_1a78 [8];
  float fStack_1a70;
  float fStack_1a6c;
  undefined1 local_1a68 [8];
  float fStack_1a60;
  float fStack_1a5c;
  undefined1 local_1a58 [8];
  float fStack_1a50;
  float fStack_1a4c;
  float local_1a48;
  float fStack_1a44;
  float fStack_1a40;
  float fStack_1a3c;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float local_1a28;
  float fStack_1a24;
  float fStack_1a20;
  float fStack_1a1c;
  BVH *local_1a18;
  Intersectors *local_1a10;
  long local_1a08;
  long local_1a00;
  size_t local_19f8;
  ulong local_19f0;
  RTCIntersectArguments *local_19e8;
  ulong local_19e0;
  float local_19d8 [4];
  undefined1 local_19c8 [16];
  undefined1 local_19b8 [16];
  undefined4 local_19a8;
  undefined4 uStack_19a4;
  undefined4 uStack_19a0;
  undefined4 uStack_199c;
  undefined1 local_1998 [16];
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  uint local_1968;
  uint uStack_1964;
  uint uStack_1960;
  uint uStack_195c;
  uint local_1958;
  uint uStack_1954;
  uint uStack_1950;
  uint uStack_194c;
  uint local_1948;
  uint uStack_1944;
  uint uStack_1940;
  uint uStack_193c;
  uint local_1938;
  uint uStack_1934;
  uint uStack_1930;
  uint uStack_192c;
  float local_1928;
  float fStack_1924;
  float fStack_1920;
  float fStack_191c;
  float local_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float local_1908;
  float fStack_1904;
  float fStack_1900;
  float fStack_18fc;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float local_18e8;
  float fStack_18e4;
  float fStack_18e0;
  float fStack_18dc;
  float local_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  vbool<4> valid0;
  TravRayK<4,_true> tray;
  float local_17a8;
  float fStack_17a4;
  float fStack_17a0;
  float local_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_1750;
  float fStack_174c;
  float fStack_1730;
  float fStack_172c;
  vint<4> itime;
  vfloat<4> ftime;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = (((BVH *)This->ptr)->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar189._8_4_ = 0xffffffff;
    auVar189._0_8_ = 0xffffffffffffffff;
    auVar189._12_4_ = 0xffffffff;
    auVar177 = *(undefined1 (*) [16])(ray + 0x80);
    auVar232._0_12_ = ZEXT812(0);
    auVar232._12_4_ = 0;
    auVar101._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar177._0_4_);
    auVar101._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar177._4_4_);
    auVar101._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar177._8_4_);
    auVar101._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar177._12_4_);
    uVar54 = movmskps((int)context,auVar101);
    sVar56 = (size_t)uVar54;
    if (uVar54 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      uVar54 = (uint)DAT_01f46710;
      uVar226 = DAT_01f46710._4_4_;
      uVar227 = DAT_01f46710._8_4_;
      uVar228 = DAT_01f46710._12_4_;
      auVar197 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      fVar214 = (float)DAT_01f4bd50;
      fVar217 = DAT_01f4bd50._4_4_;
      fVar220 = DAT_01f4bd50._8_4_;
      fVar222 = DAT_01f4bd50._12_4_;
      auVar126._4_4_ = -(uint)((float)(tray.dir.field_0._4_4_ & uVar226) < fVar217);
      auVar126._0_4_ = -(uint)((float)(tray.dir.field_0._0_4_ & uVar54) < fVar214);
      auVar126._8_4_ = -(uint)((float)(tray.dir.field_0._8_4_ & uVar227) < fVar220);
      auVar126._12_4_ = -(uint)((float)(tray.dir.field_0._12_4_ & uVar228) < fVar222);
      auVar144 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar69._4_4_ = -(uint)((float)(tray.dir.field_0._20_4_ & uVar226) < fVar217);
      auVar69._0_4_ = -(uint)((float)(tray.dir.field_0._16_4_ & uVar54) < fVar214);
      auVar102 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)blendvps(auVar197,_DAT_01f76a70,auVar126);
      auVar69._8_4_ = -(uint)((float)(tray.dir.field_0._24_4_ & uVar227) < fVar220);
      auVar69._12_4_ = -(uint)((float)(tray.dir.field_0._28_4_ & uVar228) < fVar222);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar144,_DAT_01f76a70,auVar69)
      ;
      auVar144._4_4_ = -(uint)((float)(tray.dir.field_0._36_4_ & uVar226) < fVar217);
      auVar144._0_4_ = -(uint)((float)(tray.dir.field_0._32_4_ & uVar54) < fVar214);
      auVar144._8_4_ = -(uint)((float)(tray.dir.field_0._40_4_ & uVar227) < fVar220);
      auVar144._12_4_ = -(uint)((float)(tray.dir.field_0._44_4_ & uVar228) < fVar222);
      tray.rdir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)blendvps(auVar102,_DAT_01f76a70,auVar144);
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar102._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar102._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar102._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar102._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar102);
      auVar197._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar197._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar197._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar197._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar197);
      auVar126 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar232);
      iVar240 = (int)DAT_01f45a30;
      iVar243 = DAT_01f45a30._4_4_;
      iVar246 = DAT_01f45a30._8_4_;
      iVar249 = DAT_01f45a30._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar126,auVar101);
      auVar177 = maxps(auVar177,auVar232);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar177,auVar101);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar189 ^ auVar101);
      local_1a10 = This;
      local_1a18 = (BVH *)This->ptr;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar54 = 3;
      }
      else {
        sVar56 = CONCAT71((int7)((ulong)context->args >> 8),
                          *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01;
        uVar54 = ((char)sVar56 == '\0') + 2;
      }
      pNVar65 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar66 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar226 = uVar54;
LAB_006df8db:
      do {
        do {
          root.ptr = pNVar65[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006e170b;
          pNVar65 = pNVar65 + -1;
          paVar66 = paVar66 + -1;
          aVar254.v = *(__m128 *)paVar66->v;
          auVar177._4_4_ = -(uint)(aVar254.v[1] < tray.tfar.field_0.v[1]);
          auVar177._0_4_ = -(uint)(aVar254.v[0] < tray.tfar.field_0.v[0]);
          auVar177._8_4_ = -(uint)(aVar254.v[2] < tray.tfar.field_0.v[2]);
          auVar177._12_4_ = -(uint)(aVar254._12_4_ < tray.tfar.field_0.v[3]);
          uVar226 = movmskps(uVar226,auVar177);
        } while (uVar226 == 0);
        uVar52 = (ulong)(byte)uVar226;
        uVar227 = uVar226 & 0xff;
        if (uVar54 < (uint)POPCOUNT(uVar227)) {
LAB_006df922:
          do {
            fVar214 = aVar254.v[0];
            fVar217 = aVar254.v[1];
            fVar220 = aVar254.v[2];
            fVar222 = aVar254.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006e170b;
              auVar72._4_4_ = -(uint)(fVar217 < tray.tfar.field_0.v[1]);
              auVar72._0_4_ = -(uint)(fVar214 < tray.tfar.field_0.v[0]);
              auVar72._8_4_ = -(uint)(fVar220 < tray.tfar.field_0.v[2]);
              auVar72._12_4_ = -(uint)(fVar222 < tray.tfar.field_0.v[3]);
              uVar226 = movmskps(uVar226,auVar72);
              if (uVar226 != 0) {
                local_1a08 = (ulong)((uint)root.ptr & 0xf) - 8;
                uVar52 = root.ptr & 0xfffffffffffffff0;
                local_1b68.i[0] = terminated.field_0.i[0] ^ 0xffffffff;
                local_1b68.i[1] = terminated.field_0.i[1] ^ 0xffffffff;
                local_1b68.i[2] = terminated.field_0.i[2] ^ 0xffffffff;
                local_1b68.i[3] = terminated.field_0.i[3] ^ 0xffffffff;
                lVar58 = 0;
                while (lVar58 != local_1a08) {
                  local_1a00 = lVar58;
                  lVar58 = lVar58 * 0x90;
                  uVar57 = *(ulong *)(uVar52 + 0x20 + lVar58);
                  auVar73._8_8_ = 0;
                  auVar73._0_8_ = uVar57;
                  uVar21 = *(undefined8 *)(uVar52 + 0x24 + lVar58);
                  bVar34 = (byte)uVar57;
                  bVar99 = (byte)uVar21;
                  bVar35 = (byte)(uVar57 >> 8);
                  bVar119 = (byte)((ulong)uVar21 >> 8);
                  bVar36 = (byte)(uVar57 >> 0x10);
                  bVar120 = (byte)((ulong)uVar21 >> 0x10);
                  bVar37 = (byte)(uVar57 >> 0x18);
                  bVar121 = (byte)((ulong)uVar21 >> 0x18);
                  bVar38 = (byte)(uVar57 >> 0x20);
                  bVar122 = (byte)((ulong)uVar21 >> 0x20);
                  bVar39 = (byte)(uVar57 >> 0x28);
                  bVar123 = (byte)((ulong)uVar21 >> 0x28);
                  bVar40 = (byte)(uVar57 >> 0x30);
                  bVar124 = (byte)((ulong)uVar21 >> 0x30);
                  bVar44 = (byte)((ulong)uVar21 >> 0x38);
                  bVar41 = (byte)(uVar57 >> 0x38);
                  auVar103[0] = -((byte)((bVar34 < bVar99) * bVar34 | (bVar34 >= bVar99) * bVar99)
                                 == bVar34);
                  auVar103[1] = -((byte)((bVar35 < bVar119) * bVar35 | (bVar35 >= bVar119) * bVar119
                                        ) == bVar35);
                  auVar103[2] = -((byte)((bVar36 < bVar120) * bVar36 | (bVar36 >= bVar120) * bVar120
                                        ) == bVar36);
                  auVar103[3] = -((byte)((bVar37 < bVar121) * bVar37 | (bVar37 >= bVar121) * bVar121
                                        ) == bVar37);
                  auVar103[4] = -((byte)((bVar38 < bVar122) * bVar38 | (bVar38 >= bVar122) * bVar122
                                        ) == bVar38);
                  auVar103[5] = -((byte)((bVar39 < bVar123) * bVar39 | (bVar39 >= bVar123) * bVar123
                                        ) == bVar39);
                  auVar103[6] = -((byte)((bVar40 < bVar124) * bVar40 | (bVar40 >= bVar124) * bVar124
                                        ) == bVar40);
                  auVar103[7] = -((byte)((bVar41 < bVar44) * bVar41 | (bVar41 >= bVar44) * bVar44)
                                 == bVar41);
                  auVar103[8] = 0xff;
                  auVar103[9] = 0xff;
                  auVar103[10] = 0xff;
                  auVar103[0xb] = 0xff;
                  auVar103[0xc] = 0xff;
                  auVar103[0xd] = 0xff;
                  auVar103[0xe] = 0xff;
                  auVar103[0xf] = 0xff;
                  auVar129._8_4_ = 0xffffffff;
                  auVar129._0_8_ = 0xffffffffffffffff;
                  auVar129._12_4_ = 0xffffffff;
                  auVar177 = pmovzxbd(auVar73,auVar103 ^ auVar129);
                  auVar177 = auVar177 ^ auVar129;
                  auVar74._0_4_ = auVar177._0_4_ << 0x1f;
                  auVar74._4_4_ = auVar177._4_4_ << 0x1f;
                  auVar74._8_4_ = auVar177._8_4_ << 0x1f;
                  auVar74._12_4_ = auVar177._12_4_ << 0x1f;
                  uVar226 = movmskps((int)sVar56,auVar74);
                  sVar56 = (size_t)uVar226;
                  if (uVar226 != 0) {
                    fVar214 = *(float *)(uVar52 + 0x80 + lVar58);
                    fVar217 = *(float *)(uVar52 + 0x84 + lVar58);
                    fVar220 = fVar217 * (*(float *)(ray + 0x70) - fVar214);
                    fVar222 = fVar217 * (*(float *)(ray + 0x74) - fVar214);
                    fVar98 = fVar217 * (*(float *)(ray + 0x78) - fVar214);
                    fVar217 = fVar217 * (*(float *)(ray + 0x7c) - fVar214);
                    uVar57 = sVar56 & 0xff;
                    local_19f8 = lVar58 + uVar52;
                    sVar56 = lVar58 + uVar52;
                    do {
                      local_19f0 = uVar57;
                      lVar58 = 0;
                      if (uVar57 != 0) {
                        for (; (uVar57 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                        }
                      }
                      auVar75._8_8_ = 0;
                      auVar75._0_8_ = *(ulong *)(sVar56 + 0x20);
                      auVar177 = pmovzxbd(auVar75,auVar75);
                      fVar214 = *(float *)(sVar56 + 0x38);
                      fVar142 = *(float *)(sVar56 + 0x44);
                      local_1b48[0] = (float)auVar177._0_4_ * fVar142 + fVar214;
                      local_1b48[1] = (float)auVar177._4_4_ * fVar142 + fVar214;
                      local_1b48[2] = (float)auVar177._8_4_ * fVar142 + fVar214;
                      local_1b48[3] = (float)auVar177._12_4_ * fVar142 + fVar214;
                      fVar166 = local_1b48[lVar58];
                      auVar76._8_8_ = 0;
                      auVar76._0_8_ = *(ulong *)(sVar56 + 0x50);
                      auVar177 = pmovzxbd(auVar76,auVar76);
                      fVar152 = *(float *)(sVar56 + 0x68);
                      fVar173 = *(float *)(sVar56 + 0x74);
                      local_19d8[0] = (float)auVar177._0_4_ * fVar173 + fVar152;
                      local_19d8[1] = (float)auVar177._4_4_ * fVar173 + fVar152;
                      local_19d8[2] = (float)auVar177._8_4_ * fVar173 + fVar152;
                      local_19d8[3] = (float)auVar177._12_4_ * fVar173 + fVar152;
                      fVar196 = local_19d8[lVar58] - fVar166;
                      auVar167._8_8_ = 0;
                      auVar167._0_8_ = *(ulong *)(sVar56 + 0x24);
                      auVar177 = pmovzxbd(auVar167,auVar167);
                      local_1b48[0] = (float)auVar177._0_4_ * fVar142 + fVar214;
                      local_1b48[1] = (float)auVar177._4_4_ * fVar142 + fVar214;
                      local_1b48[2] = (float)auVar177._8_4_ * fVar142 + fVar214;
                      local_1b48[3] = (float)auVar177._12_4_ * fVar142 + fVar214;
                      fVar214 = local_1b48[lVar58];
                      auVar104._8_8_ = 0;
                      auVar104._0_8_ = *(ulong *)(sVar56 + 0x54);
                      auVar177 = pmovzxbd(auVar104,auVar104);
                      local_19d8[0] = (float)auVar177._0_4_ * fVar173 + fVar152;
                      local_19d8[1] = (float)auVar177._4_4_ * fVar173 + fVar152;
                      local_19d8[2] = (float)auVar177._8_4_ * fVar173 + fVar152;
                      local_19d8[3] = (float)auVar177._12_4_ * fVar173 + fVar152;
                      fVar100 = local_19d8[lVar58] - fVar214;
                      auVar130._8_8_ = 0;
                      auVar130._0_8_ = *(ulong *)(sVar56 + 0x28);
                      auVar177 = pmovzxbd(auVar130,auVar130);
                      fVar142 = *(float *)(sVar56 + 0x3c);
                      fVar152 = *(float *)(sVar56 + 0x48);
                      local_1b48[0] = (float)auVar177._0_4_ * fVar152 + fVar142;
                      local_1b48[1] = (float)auVar177._4_4_ * fVar152 + fVar142;
                      local_1b48[2] = (float)auVar177._8_4_ * fVar152 + fVar142;
                      local_1b48[3] = (float)auVar177._12_4_ * fVar152 + fVar142;
                      fVar173 = local_1b48[lVar58];
                      auVar131._8_8_ = 0;
                      auVar131._0_8_ = *(ulong *)(sVar56 + 0x58);
                      auVar177 = pmovzxbd(auVar131,auVar131);
                      fVar153 = *(float *)(sVar56 + 0x6c);
                      fVar165 = *(float *)(sVar56 + 0x78);
                      local_19d8[0] = (float)auVar177._0_4_ * fVar165 + fVar153;
                      local_19d8[1] = (float)auVar177._4_4_ * fVar165 + fVar153;
                      local_19d8[2] = (float)auVar177._8_4_ * fVar165 + fVar153;
                      local_19d8[3] = (float)auVar177._12_4_ * fVar165 + fVar153;
                      fVar125 = local_19d8[lVar58] - fVar173;
                      auVar187._8_8_ = 0;
                      auVar187._0_8_ = *(ulong *)(sVar56 + 0x2c);
                      auVar177 = pmovzxbd(auVar187,auVar187);
                      local_1b48[0] = (float)auVar177._0_4_ * fVar152 + fVar142;
                      local_1b48[1] = (float)auVar177._4_4_ * fVar152 + fVar142;
                      local_1b48[2] = (float)auVar177._8_4_ * fVar152 + fVar142;
                      local_1b48[3] = (float)auVar177._12_4_ * fVar152 + fVar142;
                      fVar142 = local_1b48[lVar58];
                      auVar145._8_8_ = 0;
                      auVar145._0_8_ = *(ulong *)(sVar56 + 0x5c);
                      auVar177 = pmovzxbd(auVar145,auVar145);
                      local_19d8[0] = (float)auVar177._0_4_ * fVar165 + fVar153;
                      local_19d8[1] = (float)auVar177._4_4_ * fVar165 + fVar153;
                      local_19d8[2] = (float)auVar177._8_4_ * fVar165 + fVar153;
                      local_19d8[3] = (float)auVar177._12_4_ * fVar165 + fVar153;
                      fVar143 = local_19d8[lVar58] - fVar142;
                      auVar155._8_8_ = 0;
                      auVar155._0_8_ = *(ulong *)(sVar56 + 0x30);
                      auVar177 = pmovzxbd(auVar155,auVar155);
                      fVar152 = *(float *)(sVar56 + 0x40);
                      fVar153 = *(float *)(sVar56 + 0x4c);
                      local_1b48[0] = (float)auVar177._0_4_ * fVar153 + fVar152;
                      local_1b48[1] = (float)auVar177._4_4_ * fVar153 + fVar152;
                      local_1b48[2] = (float)auVar177._8_4_ * fVar153 + fVar152;
                      local_1b48[3] = (float)auVar177._12_4_ * fVar153 + fVar152;
                      fVar165 = local_1b48[lVar58];
                      auVar156._8_8_ = 0;
                      auVar156._0_8_ = *(ulong *)(sVar56 + 0x60);
                      auVar177 = pmovzxbd(auVar156,auVar156);
                      fVar174 = *(float *)(sVar56 + 0x70);
                      fVar175 = *(float *)(sVar56 + 0x7c);
                      local_19d8[0] = (float)auVar177._0_4_ * fVar175 + fVar174;
                      local_19d8[1] = (float)auVar177._4_4_ * fVar175 + fVar174;
                      local_19d8[2] = (float)auVar177._8_4_ * fVar175 + fVar174;
                      local_19d8[3] = (float)auVar177._12_4_ * fVar175 + fVar174;
                      fVar154 = local_19d8[lVar58] - fVar165;
                      auVar206._8_8_ = 0;
                      auVar206._0_8_ = *(ulong *)(sVar56 + 0x34);
                      auVar177 = pmovzxbd(auVar206,auVar206);
                      local_1b48[0] = (float)auVar177._0_4_ * fVar153 + fVar152;
                      local_1b48[1] = (float)auVar177._4_4_ * fVar153 + fVar152;
                      local_1b48[2] = (float)auVar177._8_4_ * fVar153 + fVar152;
                      local_1b48[3] = (float)auVar177._12_4_ * fVar153 + fVar152;
                      fVar152 = local_1b48[lVar58];
                      auVar168._8_8_ = 0;
                      auVar168._0_8_ = *(ulong *)(sVar56 + 100);
                      auVar177 = pmovzxbd(auVar168,auVar168);
                      local_19d8[0] = (float)auVar177._0_4_ * fVar175 + fVar174;
                      local_19d8[1] = (float)auVar177._4_4_ * fVar175 + fVar174;
                      local_19d8[2] = (float)auVar177._8_4_ * fVar175 + fVar174;
                      local_19d8[3] = (float)auVar177._12_4_ * fVar175 + fVar174;
                      fVar153 = local_19d8[lVar58] - fVar152;
                      fVar174 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
                      fVar175 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
                      auVar77._0_8_ =
                           CONCAT44(((fVar196 * fVar222 + fVar166) - (float)tray.org.field_0._4_4_)
                                    * tray.rdir.field_0._4_4_,
                                    ((fVar196 * fVar220 + fVar166) - (float)tray.org.field_0._0_4_)
                                    * tray.rdir.field_0._0_4_);
                      auVar77._8_4_ =
                           ((fVar196 * fVar98 + fVar166) - (float)tray.org.field_0._8_4_) *
                           tray.rdir.field_0._8_4_;
                      auVar77._12_4_ =
                           ((fVar196 * fVar217 + fVar166) - (float)tray.org.field_0._12_4_) *
                           tray.rdir.field_0._12_4_;
                      auVar132._0_8_ =
                           CONCAT44(((fVar125 * fVar222 + fVar173) - (float)tray.org.field_0._20_4_)
                                    * tray.rdir.field_0._20_4_,
                                    ((fVar125 * fVar220 + fVar173) - (float)tray.org.field_0._16_4_)
                                    * tray.rdir.field_0._16_4_);
                      auVar132._8_4_ =
                           ((fVar125 * fVar98 + fVar173) - (float)tray.org.field_0._24_4_) *
                           tray.rdir.field_0._24_4_;
                      auVar132._12_4_ =
                           ((fVar125 * fVar217 + fVar173) - (float)tray.org.field_0._28_4_) *
                           tray.rdir.field_0._28_4_;
                      auVar157._0_8_ =
                           CONCAT44(((fVar154 * fVar222 + fVar165) - fVar174) *
                                    tray.rdir.field_0._36_4_,
                                    ((fVar154 * fVar220 + fVar165) - (float)tray.org.field_0._32_8_)
                                    * tray.rdir.field_0._32_4_);
                      auVar157._8_4_ =
                           ((fVar154 * fVar98 + fVar165) - (float)tray.org.field_0._40_8_) *
                           tray.rdir.field_0._40_4_;
                      auVar157._12_4_ =
                           ((fVar154 * fVar217 + fVar165) - fVar175) * tray.rdir.field_0._44_4_;
                      auVar105._0_4_ =
                           ((fVar100 * fVar220 + fVar214) - (float)tray.org.field_0._0_4_) *
                           tray.rdir.field_0._0_4_;
                      auVar105._4_4_ =
                           ((fVar100 * fVar222 + fVar214) - (float)tray.org.field_0._4_4_) *
                           tray.rdir.field_0._4_4_;
                      auVar105._8_4_ =
                           ((fVar100 * fVar98 + fVar214) - (float)tray.org.field_0._8_4_) *
                           tray.rdir.field_0._8_4_;
                      auVar105._12_4_ =
                           ((fVar100 * fVar217 + fVar214) - (float)tray.org.field_0._12_4_) *
                           tray.rdir.field_0._12_4_;
                      auVar146._0_4_ =
                           ((fVar143 * fVar220 + fVar142) - (float)tray.org.field_0._16_4_) *
                           tray.rdir.field_0._16_4_;
                      auVar146._4_4_ =
                           ((fVar143 * fVar222 + fVar142) - (float)tray.org.field_0._20_4_) *
                           tray.rdir.field_0._20_4_;
                      auVar146._8_4_ =
                           ((fVar143 * fVar98 + fVar142) - (float)tray.org.field_0._24_4_) *
                           tray.rdir.field_0._24_4_;
                      auVar146._12_4_ =
                           ((fVar143 * fVar217 + fVar142) - (float)tray.org.field_0._28_4_) *
                           tray.rdir.field_0._28_4_;
                      auVar169._0_4_ =
                           ((fVar153 * fVar220 + fVar152) - (float)tray.org.field_0._32_8_) *
                           tray.rdir.field_0._32_4_;
                      auVar169._4_4_ =
                           ((fVar153 * fVar222 + fVar152) - fVar174) * tray.rdir.field_0._36_4_;
                      auVar169._8_4_ =
                           ((fVar153 * fVar98 + fVar152) - (float)tray.org.field_0._40_8_) *
                           tray.rdir.field_0._40_4_;
                      auVar169._12_4_ =
                           ((fVar153 * fVar217 + fVar152) - fVar175) * tray.rdir.field_0._44_4_;
                      auVar178._8_4_ = auVar77._8_4_;
                      auVar178._0_8_ = auVar77._0_8_;
                      auVar178._12_4_ = auVar77._12_4_;
                      auVar177 = minps(auVar178,auVar105);
                      auVar188._8_4_ = auVar132._8_4_;
                      auVar188._0_8_ = auVar132._0_8_;
                      auVar188._12_4_ = auVar132._12_4_;
                      auVar189 = minps(auVar188,auVar146);
                      auVar177 = maxps(auVar177,auVar189);
                      auVar190._8_4_ = auVar157._8_4_;
                      auVar190._0_8_ = auVar157._0_8_;
                      auVar190._12_4_ = auVar157._12_4_;
                      auVar189 = minps(auVar190,auVar169);
                      auVar177 = maxps(auVar177,auVar189);
                      auVar179._0_4_ = auVar177._0_4_ * 0.99999964;
                      auVar179._4_4_ = auVar177._4_4_ * 0.99999964;
                      auVar179._8_4_ = auVar177._8_4_ * 0.99999964;
                      auVar179._12_4_ = auVar177._12_4_ * 0.99999964;
                      auVar177 = maxps(auVar77,auVar105);
                      auVar189 = maxps(auVar132,auVar146);
                      auVar177 = minps(auVar177,auVar189);
                      auVar189 = maxps(auVar157,auVar169);
                      auVar177 = minps(auVar177,auVar189);
                      auVar78._0_4_ = auVar177._0_4_ * 1.0000004;
                      auVar78._4_4_ = auVar177._4_4_ * 1.0000004;
                      auVar78._8_4_ = auVar177._8_4_ * 1.0000004;
                      auVar78._12_4_ = auVar177._12_4_ * 1.0000004;
                      auVar189 = maxps(auVar179,(undefined1  [16])tray.tnear.field_0);
                      auVar177 = minps(auVar78,(undefined1  [16])tray.tfar.field_0);
                      uVar226 = local_1b68.i[1];
                      uVar227 = local_1b68.i[2];
                      uVar228 = local_1b68.i[3];
                      auVar180._0_4_ = -(uint)(auVar189._0_4_ <= auVar177._0_4_) & local_1b68.i[0];
                      auVar180._4_4_ = -(uint)(auVar189._4_4_ <= auVar177._4_4_) & uVar226;
                      auVar180._8_4_ = -(uint)(auVar189._8_4_ <= auVar177._8_4_) & uVar227;
                      auVar180._12_4_ = -(uint)(auVar189._12_4_ <= auVar177._12_4_) & uVar228;
                      iVar55 = movmskps((int)sVar56,auVar180);
                      if (iVar55 == 0) {
                        bVar67 = false;
                      }
                      else {
                        uVar22 = *(ushort *)(sVar56 + lVar58 * 8);
                        local_1938 = *(uint *)(sVar56 + 0x88);
                        valid_i = (vint<4> *)(ulong)local_1938;
                        local_1948 = *(uint *)(sVar56 + 4 + lVar58 * 8);
                        valid0.field_0 = local_1b68;
                        uVar51 = movmskps((int)in_R9,(undefined1  [16])local_1b68);
                        uVar57 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar51);
                        local_1be0 = uVar22 & 0x7fff;
                        local_1bdc = (uint)*(ushort *)(sVar56 + 2 + lVar58 * 8);
                        local_1be4 = local_1bdc & 0x7fff;
                        pRVar53 = (RTCIntersectArguments *)(ulong)(-1 < (short)uVar22);
                        local_19e8 = pRVar53;
                        local_18d8 = (float)local_1be0;
                        fStack_18d4 = (float)(local_1be0 + 1);
                        fStack_18d0 = (float)(local_1be0 + 1);
                        fStack_18cc = (float)local_1be0;
                        local_18e8 = (float)local_1be4;
                        fStack_18e4 = (float)local_1be4;
                        fStack_18e0 = (float)(local_1be4 + 1);
                        fStack_18dc = (float)(local_1be4 + 1);
                        uStack_1934 = local_1938;
                        uStack_1930 = local_1938;
                        uStack_192c = local_1938;
                        local_19e0 = (ulong)local_1948;
                        uStack_1944 = local_1948;
                        uStack_1940 = local_1948;
                        uStack_193c = local_1948;
                        while (uVar57 != 0) {
                          lVar58 = 0;
                          if (uVar57 != 0) {
                            for (; (uVar57 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                            }
                          }
                          uVar57 = uVar57 - 1 & uVar57;
                          local_1a98 = context->scene;
                          pGVar24 = (local_1a98->geometries).items[(long)valid_i].ptr;
                          lVar25 = *(long *)&pGVar24->field_0x58;
                          lVar60 = pGVar24[1].super_RefCount.refCounter.
                                   super___atomic_base<unsigned_long>._M_i * local_19e0;
                          fVar214 = pGVar24->fnumTimeSegments;
                          fVar142 = (pGVar24->time_range).lower;
                          auVar133._0_4_ = (pGVar24->time_range).upper - fVar142;
                          auVar106._4_4_ = fVar142;
                          auVar106._0_4_ = fVar142;
                          auVar106._8_4_ = fVar142;
                          auVar106._12_4_ = fVar142;
                          auVar158._0_4_ = *(float *)(ray + 0x70) - fVar142;
                          auVar158._4_4_ = *(float *)(ray + 0x74) - fVar142;
                          auVar158._8_4_ = *(float *)(ray + 0x78) - fVar142;
                          auVar158._12_4_ = *(float *)(ray + 0x7c) - fVar142;
                          auVar133._4_4_ = auVar133._0_4_;
                          auVar133._8_4_ = auVar133._0_4_;
                          auVar133._12_4_ = auVar133._0_4_;
                          auVar177 = divps(auVar158,auVar133);
                          auVar159._0_4_ = auVar177._0_4_ * fVar214;
                          auVar159._4_4_ = auVar177._4_4_ * fVar214;
                          auVar159._8_4_ = auVar177._8_4_ * fVar214;
                          auVar159._12_4_ = auVar177._12_4_ * fVar214;
                          auVar177 = roundps(auVar106,auVar159,1);
                          auVar79._0_4_ = fVar214 + -1.0;
                          auVar79._4_4_ = auVar79._0_4_;
                          auVar79._8_4_ = auVar79._0_4_;
                          auVar79._12_4_ = auVar79._0_4_;
                          auVar177 = minps(auVar177,auVar79);
                          auVar177 = maxps(auVar177,_DAT_01f45a50);
                          ftime.field_0.v[0] = auVar159._0_4_ - auVar177._0_4_;
                          ftime.field_0.v[1] = auVar159._4_4_ - auVar177._4_4_;
                          ftime.field_0.v[2] = auVar159._8_4_ - auVar177._8_4_;
                          ftime.field_0.v[3] = auVar159._12_4_ - auVar177._12_4_;
                          itime.field_0.i[0] = (int)auVar177._0_4_;
                          itime.field_0.i[1] = (int)auVar177._4_4_;
                          itime.field_0.i[2] = (int)auVar177._8_4_;
                          itime.field_0.i[3] = (int)auVar177._12_4_;
                          uVar202 = *(uint *)(lVar25 + 4 + lVar60);
                          uVar62 = (ulong)uVar202;
                          uVar59 = (ulong)(uVar202 * local_1be4 +
                                          *(int *)(lVar25 + lVar60) + local_1be0);
                          lVar26 = *(long *)&pGVar24[2].numPrimitives;
                          lVar63 = (long)itime.field_0.i[lVar58] * 0x38;
                          lVar27 = *(long *)(lVar26 + lVar63);
                          lVar28 = *(long *)(lVar26 + 0x10 + lVar63);
                          lVar29 = *(long *)(lVar26 + 0x48 + lVar63);
                          pfVar1 = (float *)(lVar27 + lVar28 * uVar59);
                          lVar63 = *(long *)(lVar26 + 0x38 + lVar63);
                          pfVar2 = (float *)(lVar63 + lVar29 * uVar59);
                          lVar26 = uVar59 + uVar62;
                          pfVar3 = (float *)(lVar27 + (uVar59 + 1) * lVar28);
                          lVar64 = uVar59 + uVar62 + 1;
                          pfVar4 = (float *)(lVar63 + lVar29 * (uVar59 + 1));
                          pfVar5 = (float *)(lVar27 + lVar26 * lVar28);
                          pfVar6 = (float *)(lVar63 + lVar29 * lVar26);
                          pfVar7 = (float *)(lVar27 + lVar64 * lVar28);
                          pcVar61 = (code *)((long)&local_19e8->flags + uVar59 + 1);
                          pfVar8 = (float *)(lVar63 + lVar29 * lVar64);
                          pfVar9 = (float *)(lVar27 + (long)pcVar61 * lVar28);
                          pcVar10 = (code *)((long)&local_19e8->flags + lVar64);
                          pfVar11 = (float *)(lVar63 + lVar29 * (long)pcVar61);
                          pfVar12 = (float *)(lVar27 + (long)pcVar10 * lVar28);
                          pfVar13 = (float *)(lVar63 + lVar29 * (long)pcVar10);
                          uVar59 = 0;
                          if (-1 < (short)local_1bdc) {
                            uVar59 = uVar62;
                          }
                          pfVar14 = (float *)(lVar27 + (lVar26 + uVar59) * lVar28);
                          pfVar15 = (float *)(lVar63 + lVar29 * (lVar26 + uVar59));
                          pfVar16 = (float *)(lVar27 + (lVar64 + uVar59) * lVar28);
                          fVar214 = *(float *)((long)&stack_node[-2].ptr + lVar58 * 4);
                          pfVar17 = (float *)(lVar63 + lVar29 * (lVar64 + uVar59));
                          fVar163 = (*pfVar4 - *pfVar3) * fVar214 + *pfVar3;
                          fVar164 = (pfVar4[1] - pfVar3[1]) * fVar214 + pfVar3[1];
                          fVar176 = (pfVar4[2] - pfVar3[2]) * fVar214 + pfVar3[2];
                          fVar238 = (*pfVar6 - *pfVar5) * fVar214 + *pfVar5;
                          local_1bd8._0_4_ = (pfVar6[1] - pfVar5[1]) * fVar214 + pfVar5[1];
                          fVar239 = (pfVar6[2] - pfVar5[2]) * fVar214 + pfVar5[2];
                          fVar215 = (*pfVar8 - *pfVar7) * fVar214 + *pfVar7;
                          fVar219 = (pfVar8[1] - pfVar7[1]) * fVar214 + pfVar7[1];
                          fVar221 = (pfVar8[2] - pfVar7[2]) * fVar214 + pfVar7[2];
                          fVar174 = (*pfVar11 - *pfVar9) * fVar214 + *pfVar9;
                          fVar196 = (pfVar11[1] - pfVar9[1]) * fVar214 + pfVar9[1];
                          fVar125 = (pfVar11[2] - pfVar9[2]) * fVar214 + pfVar9[2];
                          fVar229 = (*pfVar13 - *pfVar12) * fVar214 + *pfVar12;
                          fVar233 = (pfVar13[1] - pfVar12[1]) * fVar214 + pfVar12[1];
                          fVar235 = (pfVar13[2] - pfVar12[2]) * fVar214 + pfVar12[2];
                          fStack_1bcc = (pfVar15[1] - pfVar14[1]) * fVar214 + pfVar14[1];
                          fVar97 = (pfVar15[2] - pfVar14[2]) * fVar214 + pfVar14[2];
                          fVar252 = (*pfVar17 - *pfVar16) * fVar214 + *pfVar16;
                          fVar256 = (pfVar17[1] - pfVar16[1]) * fVar214 + pfVar16[1];
                          fVar258 = (pfVar17[2] - pfVar16[2]) * fVar214 + pfVar16[2];
                          local_1b48[0] = fVar235;
                          local_1b48[1] = fVar221;
                          local_1a28 = fVar215;
                          fStack_1a24 = fVar219;
                          fStack_1a20 = fVar221;
                          fStack_1a1c = (pfVar8[3] - pfVar7[3]) * fVar214 + pfVar7[3];
                          fVar142 = *(float *)(ray + lVar58 * 4);
                          local_1a38 = ((*pfVar2 - *pfVar1) * fVar214 + *pfVar1) - fVar142;
                          fStack_1a34 = fVar163 - fVar142;
                          fStack_1a30 = fVar215 - fVar142;
                          fStack_1a2c = fVar238 - fVar142;
                          fVar253 = fVar163 - fVar142;
                          fVar257 = fVar174 - fVar142;
                          fVar259 = fVar229 - fVar142;
                          fVar260 = fVar215 - fVar142;
                          fVar154 = fVar238 - fVar142;
                          fVar149 = fVar215 - fVar142;
                          fVar151 = fVar252 - fVar142;
                          fVar142 = ((*pfVar15 - *pfVar14) * fVar214 + *pfVar14) - fVar142;
                          fVar166 = *(float *)(ray + lVar58 * 4 + 0x10);
                          local_1a48 = ((pfVar2[1] - pfVar1[1]) * fVar214 + pfVar1[1]) - fVar166;
                          fStack_1a44 = fVar164 - fVar166;
                          fStack_1a40 = fVar219 - fVar166;
                          fStack_1a3c = (float)local_1bd8._0_4_ - fVar166;
                          fVar241 = fVar164 - fVar166;
                          fVar244 = fVar196 - fVar166;
                          fVar247 = fVar233 - fVar166;
                          fVar250 = fVar219 - fVar166;
                          local_1bd8._4_4_ = fVar219;
                          fStack_1bd0 = fVar256;
                          fVar175 = (float)local_1bd8._0_4_ - fVar166;
                          fVar100 = fVar219 - fVar166;
                          fVar143 = fVar256 - fVar166;
                          fVar166 = fStack_1bcc - fVar166;
                          local_1918 = *(float *)(ray + lVar58 * 4 + 0x20);
                          fVar183 = ((pfVar2[2] - pfVar1[2]) * fVar214 + pfVar1[2]) - local_1918;
                          fVar185 = fVar176 - local_1918;
                          fVar194 = fVar221 - local_1918;
                          fVar218 = fVar239 - local_1918;
                          local_18f8 = fVar239 - local_1918;
                          fStack_18f4 = fVar221 - local_1918;
                          fStack_18f0 = fVar258 - local_1918;
                          fStack_18ec = fVar97 - local_1918;
                          local_1a58._0_4_ = fVar154 - local_1a38;
                          local_1a58._4_4_ = fVar149 - fStack_1a34;
                          fStack_1a50 = fVar151 - fStack_1a30;
                          fStack_1a4c = fVar142 - fStack_1a2c;
                          local_1a78._0_4_ = fVar175 - local_1a48;
                          local_1a78._4_4_ = fVar100 - fStack_1a44;
                          fStack_1a70 = fVar143 - fStack_1a40;
                          fStack_1a6c = fVar166 - fStack_1a3c;
                          local_1a68._0_4_ = local_18f8 - fVar183;
                          local_1a68._4_4_ = fStack_18f4 - fVar185;
                          fStack_1a60 = fStack_18f0 - fVar194;
                          fStack_1a5c = fStack_18ec - fVar218;
                          local_1c58._4_4_ = *(undefined4 *)(ray + lVar58 * 4 + 0x50);
                          fStack_1c34 = *(float *)(ray + lVar58 * 4 + 0x60);
                          local_1c78._4_4_ = *(undefined4 *)(ray + lVar58 * 4 + 0x40);
                          fVar68 = ((float)local_1a78._0_4_ * (local_18f8 + fVar183) -
                                   (fVar175 + local_1a48) * (float)local_1a68._0_4_) *
                                   (float)local_1c78._4_4_ +
                                   ((fVar154 + local_1a38) * (float)local_1a68._0_4_ -
                                   (local_18f8 + fVar183) * (float)local_1a58._0_4_) *
                                   (float)local_1c58._4_4_ +
                                   ((float)local_1a58._0_4_ * (fVar175 + local_1a48) -
                                   (fVar154 + local_1a38) * (float)local_1a78._0_4_) * fStack_1c34;
                          fVar96 = ((float)local_1a78._4_4_ * (fStack_18f4 + fVar185) -
                                   (fVar100 + fStack_1a44) * (float)local_1a68._4_4_) *
                                   (float)local_1c78._4_4_ +
                                   ((fVar149 + fStack_1a34) * (float)local_1a68._4_4_ -
                                   (fStack_18f4 + fVar185) * (float)local_1a58._4_4_) *
                                   (float)local_1c58._4_4_ +
                                   ((float)local_1a58._4_4_ * (fVar100 + fStack_1a44) -
                                   (fVar149 + fStack_1a34) * (float)local_1a78._4_4_) * fStack_1c34;
                          fVar148 = (fStack_1a70 * (fStack_18f0 + fVar194) -
                                    (fVar143 + fStack_1a40) * fStack_1a60) * (float)local_1c78._4_4_
                                    + ((fVar151 + fStack_1a30) * fStack_1a60 -
                                      (fStack_18f0 + fVar194) * fStack_1a50) *
                                      (float)local_1c58._4_4_ +
                                      (fStack_1a50 * (fVar143 + fStack_1a40) -
                                      (fVar151 + fStack_1a30) * fStack_1a70) * fStack_1c34;
                          fVar150 = (fStack_1a6c * (fStack_18ec + fVar218) -
                                    (fVar166 + fStack_1a3c) * fStack_1a5c) * (float)local_1c78._4_4_
                                    + ((fVar142 + fStack_1a2c) * fStack_1a5c -
                                      (fStack_18ec + fVar218) * fStack_1a4c) *
                                      (float)local_1c58._4_4_ +
                                      (fStack_1a4c * (fVar166 + fStack_1a3c) -
                                      (fVar142 + fStack_1a2c) * fStack_1a6c) * fStack_1c34;
                          fStack_1914 = local_1918;
                          fStack_1910 = local_1918;
                          fStack_190c = local_1918;
                          local_1928 = fVar176 - local_1918;
                          fStack_1924 = fVar125 - local_1918;
                          fStack_1920 = fStack_1b50 - local_1918;
                          fStack_191c = fStack_1b4c - local_1918;
                          fVar230 = local_1a38 - fVar253;
                          fVar234 = fStack_1a34 - fVar257;
                          fVar236 = fStack_1a30 - fVar259;
                          fVar237 = fStack_1a2c - fVar260;
                          fVar152 = local_1a48 - fVar241;
                          fVar173 = fStack_1a44 - fVar244;
                          fVar153 = fStack_1a40 - fVar247;
                          fVar165 = fStack_1a3c - fVar250;
                          local_1a88._0_4_ = fVar183 - local_1928;
                          local_1a88._4_4_ = fVar185 - fStack_1924;
                          fStack_1a80 = fVar194 - fStack_1920;
                          fStack_1a7c = fVar218 - fStack_191c;
                          auVar191._0_4_ =
                               (fVar152 * (fVar183 + local_1928) -
                               (local_1a48 + fVar241) * (float)local_1a88._0_4_) *
                               (float)local_1c78._4_4_ +
                               ((local_1a38 + fVar253) * (float)local_1a88._0_4_ -
                               (fVar183 + local_1928) * fVar230) * (float)local_1c58._4_4_ +
                               (fVar230 * (local_1a48 + fVar241) - (local_1a38 + fVar253) * fVar152)
                               * fStack_1c34;
                          auVar191._4_4_ =
                               (fVar173 * (fVar185 + fStack_1924) -
                               (fStack_1a44 + fVar244) * (float)local_1a88._4_4_) *
                               (float)local_1c78._4_4_ +
                               ((fStack_1a34 + fVar257) * (float)local_1a88._4_4_ -
                               (fVar185 + fStack_1924) * fVar234) * (float)local_1c58._4_4_ +
                               (fVar234 * (fStack_1a44 + fVar244) -
                               (fStack_1a34 + fVar257) * fVar173) * fStack_1c34;
                          auVar191._8_4_ =
                               (fVar153 * (fVar194 + fStack_1920) -
                               (fStack_1a40 + fVar247) * fStack_1a80) * (float)local_1c78._4_4_ +
                               ((fStack_1a30 + fVar259) * fStack_1a80 -
                               (fVar194 + fStack_1920) * fVar236) * (float)local_1c58._4_4_ +
                               (fVar236 * (fStack_1a40 + fVar247) -
                               (fStack_1a30 + fVar259) * fVar153) * fStack_1c34;
                          auVar191._12_4_ =
                               (fVar165 * (fVar218 + fStack_191c) -
                               (fStack_1a3c + fVar250) * fStack_1a7c) * (float)local_1c78._4_4_ +
                               ((fStack_1a2c + fVar260) * fStack_1a7c -
                               (fVar218 + fStack_191c) * fVar237) * (float)local_1c58._4_4_ +
                               (fVar237 * (fStack_1a3c + fVar250) -
                               (fStack_1a2c + fVar260) * fVar165) * fStack_1c34;
                          fVar184 = fVar253 - fVar154;
                          fVar186 = fVar257 - fVar149;
                          fVar195 = fVar259 - fVar151;
                          fVar223 = fVar260 - fVar142;
                          fVar205 = fVar241 - fVar175;
                          fVar209 = fVar244 - fVar100;
                          fVar211 = fVar247 - fVar143;
                          fVar213 = fVar250 - fVar166;
                          fVar242 = local_1928 - local_18f8;
                          fVar245 = fStack_1924 - fStack_18f4;
                          fVar248 = fStack_1920 - fStack_18f0;
                          fVar251 = fStack_191c - fStack_18ec;
                          local_1908 = local_1928 + local_18f8;
                          fStack_1904 = fStack_1924 + fStack_18f4;
                          fStack_1900 = fStack_1920 + fStack_18f0;
                          fStack_18fc = fStack_191c + fStack_18ec;
                          old_t = fStack_1c34;
                          fStack_1c30 = fStack_1c34;
                          fStack_1c2c = fStack_1c34;
                          local_1c58._0_4_ = local_1c58._4_4_;
                          fStack_1c50 = (float)local_1c58._4_4_;
                          fStack_1c4c = (float)local_1c58._4_4_;
                          local_1c78._0_4_ = local_1c78._4_4_;
                          fStack_1c70 = (float)local_1c78._4_4_;
                          fStack_1c6c = (float)local_1c78._4_4_;
                          auVar134._0_4_ =
                               (fVar205 * local_1908 - (fVar175 + fVar241) * fVar242) *
                               (float)local_1c78._4_4_ +
                               ((fVar154 + fVar253) * fVar242 - fVar184 * local_1908) *
                               (float)local_1c58._4_4_ +
                               (fVar184 * (fVar175 + fVar241) - (fVar154 + fVar253) * fVar205) *
                               fStack_1c34;
                          auVar134._4_4_ =
                               (fVar209 * fStack_1904 - (fVar100 + fVar244) * fVar245) *
                               (float)local_1c78._4_4_ +
                               ((fVar149 + fVar257) * fVar245 - fVar186 * fStack_1904) *
                               (float)local_1c58._4_4_ +
                               (fVar186 * (fVar100 + fVar244) - (fVar149 + fVar257) * fVar209) *
                               fStack_1c34;
                          auVar134._8_4_ =
                               (fVar211 * fStack_1900 - (fVar143 + fVar247) * fVar248) *
                               (float)local_1c78._4_4_ +
                               ((fVar151 + fVar259) * fVar248 - fVar195 * fStack_1900) *
                               (float)local_1c58._4_4_ +
                               (fVar195 * (fVar143 + fVar247) - (fVar151 + fVar259) * fVar211) *
                               fStack_1c34;
                          auVar134._12_4_ =
                               (fVar213 * fStack_18fc - (fVar166 + fVar250) * fVar251) *
                               (float)local_1c78._4_4_ +
                               ((fVar142 + fVar260) * fVar251 - fVar223 * fStack_18fc) *
                               (float)local_1c58._4_4_ +
                               (fVar223 * (fVar166 + fVar250) - (fVar142 + fVar260) * fVar213) *
                               fStack_1c34;
                          fVar142 = fVar68 + auVar191._0_4_ + auVar134._0_4_;
                          fVar175 = fVar96 + auVar191._4_4_ + auVar134._4_4_;
                          fVar143 = fVar148 + auVar191._8_4_ + auVar134._8_4_;
                          fVar149 = fVar150 + auVar191._12_4_ + auVar134._12_4_;
                          auVar80._8_4_ = fVar148;
                          auVar80._0_8_ = CONCAT44(fVar96,fVar68);
                          auVar80._12_4_ = fVar150;
                          auVar177 = minps(auVar80,auVar191);
                          auVar177 = minps(auVar177,auVar134);
                          auVar199._8_4_ = fVar148;
                          auVar199._0_8_ = CONCAT44(fVar96,fVar68);
                          auVar199._12_4_ = fVar150;
                          auVar189 = maxps(auVar199,auVar191);
                          auVar189 = maxps(auVar189,auVar134);
                          fVar166 = ABS(fVar142) * 1.1920929e-07;
                          fVar100 = ABS(fVar175) * 1.1920929e-07;
                          fVar154 = ABS(fVar143) * 1.1920929e-07;
                          fVar151 = ABS(fVar149) * 1.1920929e-07;
                          auVar200._4_4_ = -(uint)(auVar189._4_4_ <= fVar100);
                          auVar200._0_4_ = -(uint)(auVar189._0_4_ <= fVar166);
                          auVar200._8_4_ = -(uint)(auVar189._8_4_ <= fVar154);
                          auVar200._12_4_ = -(uint)(auVar189._12_4_ <= fVar151);
                          auVar81._4_4_ = -(uint)(-fVar100 <= auVar177._4_4_);
                          auVar81._0_4_ = -(uint)(-fVar166 <= auVar177._0_4_);
                          auVar81._8_4_ = -(uint)(-fVar154 <= auVar177._8_4_);
                          auVar81._12_4_ = -(uint)(-fVar151 <= auVar177._12_4_);
                          auVar200 = auVar200 | auVar81;
                          iVar240 = movmskps((int)lVar29,auVar200);
                          puVar18 = (undefined8 *)(lVar27 + lVar28 * (long)(pcVar10 + uVar59));
                          uVar21 = *puVar18;
                          uVar45 = puVar18[1];
                          puVar18 = (undefined8 *)(lVar63 + (long)(pcVar10 + uVar59) * lVar29);
                          uVar46 = *puVar18;
                          uVar47 = puVar18[1];
                          if (iVar240 == 0) {
                            uVar202 = 0;
LAB_006e0d1e:
                            local_17a8 = (float)uVar46;
                            fStack_17a4 = (float)((ulong)uVar46 >> 0x20);
                            fStack_17a0 = (float)uVar47;
                            local_1798 = (float)uVar21;
                            fStack_1794 = (float)((ulong)uVar21 >> 0x20);
                            fStack_1790 = (float)uVar45;
                            fVar230 = fStack_1a20 - fStack_190c;
                            fVar235 = fVar235 - fStack_190c;
                            fVar234 = (fVar214 * (fStack_17a0 - fStack_1790) + fStack_1790) -
                                      fStack_190c;
                            fVar258 = fVar258 - fStack_190c;
                            fVar142 = *(float *)(ray + lVar58 * 4);
                            fVar166 = *(float *)(ray + lVar58 * 4 + 0x10);
                            local_1a48 = local_1a28 - fVar142;
                            fStack_1a44 = fVar229 - fVar142;
                            fStack_1a40 = (fVar214 * (local_17a8 - local_1798) + local_1798) -
                                          fVar142;
                            fStack_1a3c = fVar252 - fVar142;
                            auVar193._0_4_ = fStack_1a24 - fVar166;
                            auVar193._4_4_ = fVar233 - fVar166;
                            auVar193._8_4_ =
                                 (fVar214 * (fStack_17a4 - fStack_1794) + fStack_1794) - fVar166;
                            auVar193._12_4_ = fVar256 - fVar166;
                            fVar238 = fVar238 - fVar142;
                            fVar215 = fVar215 - fVar142;
                            fVar236 = fStack_1750 - fVar142;
                            fVar237 = fStack_174c - fVar142;
                            local_1bd8._0_4_ = (float)local_1bd8._0_4_ - fVar166;
                            local_1bd8._4_4_ = (float)local_1bd8._4_4_ - fVar166;
                            fStack_1bd0 = fStack_1bd0 - fVar166;
                            fStack_1bcc = fStack_1bcc - fVar166;
                            fVar183 = old_t._12_4_;
                            fVar163 = fVar163 - fVar142;
                            fVar174 = fVar174 - fVar142;
                            fVar151 = fStack_1730 - fVar142;
                            fVar142 = fStack_172c - fVar142;
                            fVar164 = fVar164 - fVar166;
                            fVar196 = fVar196 - fVar166;
                            fVar233 = fVar233 - fVar166;
                            fVar219 = fVar219 - fVar166;
                            fVar153 = fVar163 - local_1a48;
                            fVar165 = fVar174 - fStack_1a44;
                            fVar175 = fVar151 - fStack_1a40;
                            fVar100 = fVar142 - fStack_1a3c;
                            fVar195 = fVar164 - auVar193._0_4_;
                            fVar223 = fVar196 - auVar193._4_4_;
                            fStack_1b50 = fVar233 - auVar193._8_4_;
                            fStack_1b4c = fVar219 - auVar193._12_4_;
                            fVar184 = local_1928 - fVar230;
                            fVar185 = fStack_1924 - fVar235;
                            fVar186 = fStack_1920 - fVar234;
                            fVar194 = fStack_191c - fVar258;
                            fVar214 = local_18f8 - local_1928;
                            fVar166 = fStack_18f4 - fStack_1924;
                            fVar152 = fStack_18f0 - fStack_1920;
                            fVar173 = fStack_18ec - fStack_191c;
                            fVar125 = local_1a48 - fVar238;
                            fVar143 = fStack_1a44 - fVar215;
                            fVar154 = fStack_1a40 - fVar236;
                            fVar149 = fStack_1a3c - fVar237;
                            fVar213 = old_t;
                            fVar221 = old_t._4_4_;
                            fVar229 = old_t._8_4_;
                            fVar218 = auVar193._0_4_ - (float)local_1bd8._0_4_;
                            fVar205 = auVar193._4_4_ - (float)local_1bd8._4_4_;
                            fVar209 = auVar193._8_4_ - fStack_1bd0;
                            fVar211 = auVar193._12_4_ - fStack_1bcc;
                            fVar150 = (fVar195 * (local_1928 + fVar230) -
                                      (fVar164 + auVar193._0_4_) * fVar184) *
                                      (float)local_1c78._0_4_ +
                                      ((fVar163 + local_1a48) * fVar184 -
                                      (local_1928 + fVar230) * fVar153) * (float)local_1c58._0_4_ +
                                      (fVar153 * (fVar164 + auVar193._0_4_) -
                                      (fVar163 + local_1a48) * fVar195) * fVar213;
                            fVar176 = (fVar223 * (fStack_1924 + fVar235) -
                                      (fVar196 + auVar193._4_4_) * fVar185) *
                                      (float)local_1c78._4_4_ +
                                      ((fVar174 + fStack_1a44) * fVar185 -
                                      (fStack_1924 + fVar235) * fVar165) * (float)local_1c58._4_4_ +
                                      (fVar165 * (fVar196 + auVar193._4_4_) -
                                      (fVar174 + fStack_1a44) * fVar223) * fVar221;
                            local_1a68 = (undefined1  [8])CONCAT44(fVar176,fVar150);
                            fStack_1a60 = (fStack_1b50 * (fStack_1920 + fVar234) -
                                          (fVar233 + auVar193._8_4_) * fVar186) * fStack_1c70 +
                                          ((fVar151 + fStack_1a40) * fVar186 -
                                          (fStack_1920 + fVar234) * fVar175) * fStack_1c50 +
                                          (fVar175 * (fVar233 + auVar193._8_4_) -
                                          (fVar151 + fStack_1a40) * fStack_1b50) * fVar229;
                            fStack_1a5c = (fStack_1b4c * (fStack_191c + fVar258) -
                                          (fVar219 + auVar193._12_4_) * fVar194) * fStack_1c6c +
                                          ((fVar142 + fStack_1a3c) * fVar194 -
                                          (fStack_191c + fVar258) * fVar100) * fStack_1c4c +
                                          (fVar100 * (fVar219 + auVar193._12_4_) -
                                          (fVar142 + fStack_1a3c) * fStack_1b4c) * fVar183;
                            local_1a38 = fVar230 - local_18f8;
                            fStack_1a34 = fVar235 - fStack_18f4;
                            fStack_1a30 = fVar234 - fStack_18f0;
                            fStack_1a2c = fVar258 - fStack_18ec;
                            local_1a78._0_4_ =
                                 (fVar218 * (local_18f8 + fVar230) -
                                 (auVar193._0_4_ + (float)local_1bd8._0_4_) * local_1a38) *
                                 (float)local_1c78._0_4_ +
                                 ((local_1a48 + fVar238) * local_1a38 -
                                 (local_18f8 + fVar230) * fVar125) * (float)local_1c58._0_4_ +
                                 (fVar125 * (auVar193._0_4_ + (float)local_1bd8._0_4_) -
                                 (local_1a48 + fVar238) * fVar218) * fVar213;
                            local_1a78._4_4_ =
                                 (fVar205 * (fStack_18f4 + fVar235) -
                                 (auVar193._4_4_ + (float)local_1bd8._4_4_) * fStack_1a34) *
                                 (float)local_1c78._4_4_ +
                                 ((fStack_1a44 + fVar215) * fStack_1a34 -
                                 (fStack_18f4 + fVar235) * fVar143) * (float)local_1c58._4_4_ +
                                 (fVar143 * (auVar193._4_4_ + (float)local_1bd8._4_4_) -
                                 (fStack_1a44 + fVar215) * fVar205) * fVar221;
                            fStack_1a70 = (fVar209 * (fStack_18f0 + fVar234) -
                                          (auVar193._8_4_ + fStack_1bd0) * fStack_1a30) *
                                          fStack_1c70 +
                                          ((fStack_1a40 + fVar236) * fStack_1a30 -
                                          (fStack_18f0 + fVar234) * fVar154) * fStack_1c50 +
                                          (fVar154 * (auVar193._8_4_ + fStack_1bd0) -
                                          (fStack_1a40 + fVar236) * fVar209) * fVar229;
                            fStack_1a6c = (fVar211 * (fStack_18ec + fVar258) -
                                          (auVar193._12_4_ + fStack_1bcc) * fStack_1a2c) *
                                          fStack_1c6c +
                                          ((fStack_1a3c + fVar237) * fStack_1a2c -
                                          (fStack_18ec + fVar258) * fVar149) * fStack_1c4c +
                                          (fVar149 * (auVar193._12_4_ + fStack_1bcc) -
                                          (fStack_1a3c + fVar237) * fVar211) * fVar183;
                            fVar68 = fVar238 - fVar163;
                            fVar96 = fVar215 - fVar174;
                            fVar97 = fVar236 - fVar151;
                            fVar148 = fVar237 - fVar142;
                            auVar182._0_4_ = (float)local_1bd8._0_4_ - fVar164;
                            auVar182._4_4_ = (float)local_1bd8._4_4_ - fVar196;
                            auVar182._8_4_ = fStack_1bd0 - fVar233;
                            auVar182._12_4_ = fStack_1bcc - fVar219;
                            auVar88._0_4_ =
                                 (auVar182._0_4_ * local_1908 -
                                 (fVar164 + (float)local_1bd8._0_4_) * fVar214) *
                                 (float)local_1c78._0_4_ +
                                 ((fVar163 + fVar238) * fVar214 - local_1908 * fVar68) *
                                 (float)local_1c58._0_4_ +
                                 (fVar68 * (fVar164 + (float)local_1bd8._0_4_) -
                                 (fVar163 + fVar238) * auVar182._0_4_) * fVar213;
                            auVar88._4_4_ =
                                 (auVar182._4_4_ * fStack_1904 -
                                 (fVar196 + (float)local_1bd8._4_4_) * fVar166) *
                                 (float)local_1c78._4_4_ +
                                 ((fVar174 + fVar215) * fVar166 - fStack_1904 * fVar96) *
                                 (float)local_1c58._4_4_ +
                                 (fVar96 * (fVar196 + (float)local_1bd8._4_4_) -
                                 (fVar174 + fVar215) * auVar182._4_4_) * fVar221;
                            auVar88._8_4_ =
                                 (auVar182._8_4_ * fStack_1900 - (fVar233 + fStack_1bd0) * fVar152)
                                 * fStack_1c70 +
                                 ((fVar151 + fVar236) * fVar152 - fStack_1900 * fVar97) *
                                 fStack_1c50 +
                                 (fVar97 * (fVar233 + fStack_1bd0) -
                                 (fVar151 + fVar236) * auVar182._8_4_) * fVar229;
                            auVar88._12_4_ =
                                 (auVar182._12_4_ * fStack_18fc - (fVar219 + fStack_1bcc) * fVar173)
                                 * fStack_1c6c +
                                 ((fVar142 + fVar237) * fVar173 - fStack_18fc * fVar148) *
                                 fStack_1c4c +
                                 (fVar148 * (fVar219 + fStack_1bcc) -
                                 (fVar142 + fVar237) * auVar182._12_4_) * fVar183;
                            local_1a88._0_4_ = fVar150 + (float)local_1a78._0_4_ + auVar88._0_4_;
                            local_1a88._4_4_ = fVar176 + (float)local_1a78._4_4_ + auVar88._4_4_;
                            fStack_1a80 = fStack_1a60 + fStack_1a70 + auVar88._8_4_;
                            fStack_1a7c = fStack_1a5c + fStack_1a6c + auVar88._12_4_;
                            auVar111._8_4_ = fStack_1a60;
                            auVar111._0_8_ = local_1a68;
                            auVar111._12_4_ = fStack_1a5c;
                            auVar177 = minps(auVar111,_local_1a78);
                            auVar177 = minps(auVar177,auVar88);
                            auVar189 = maxps(_local_1a68,_local_1a78);
                            auVar189 = maxps(auVar189,auVar88);
                            fStack_1a90 = ABS(fStack_1a80);
                            fStack_1a8c = ABS(fStack_1a7c);
                            uVar59 = CONCAT44(local_1a88._4_4_,local_1a88._0_4_);
                            local_1a98 = (Scene *)(uVar59 & 0x7fffffff7fffffff);
                            auVar207._4_4_ =
                                 -(uint)(auVar189._4_4_ <=
                                        ABS((float)local_1a88._4_4_) * 1.1920929e-07);
                            auVar207._0_4_ =
                                 -(uint)(auVar189._0_4_ <=
                                        ABS((float)local_1a88._0_4_) * 1.1920929e-07);
                            auVar207._8_4_ = -(uint)(auVar189._8_4_ <= fStack_1a90 * 1.1920929e-07);
                            auVar207._12_4_ =
                                 -(uint)(auVar189._12_4_ <= fStack_1a8c * 1.1920929e-07);
                            auVar112._4_4_ =
                                 -(uint)(-(ABS((float)local_1a88._4_4_) * 1.1920929e-07) <=
                                        auVar177._4_4_);
                            auVar112._0_4_ =
                                 -(uint)(-(ABS((float)local_1a88._0_4_) * 1.1920929e-07) <=
                                        auVar177._0_4_);
                            auVar112._8_4_ =
                                 -(uint)(-(fStack_1a90 * 1.1920929e-07) <= auVar177._8_4_);
                            auVar112._12_4_ =
                                 -(uint)(-(fStack_1a8c * 1.1920929e-07) <= auVar177._12_4_);
                            auVar207 = auVar207 | auVar112;
                            uVar202 = movmskps(uVar202,auVar207);
                            pRVar53 = (RTCIntersectArguments *)(ulong)uVar202;
                            local_1918 = fStack_190c;
                            fStack_1914 = fStack_190c;
                            fStack_1910 = fStack_190c;
                            if (uVar202 != 0) {
                              _local_1a58 = auVar182;
                              local_1a28 = fVar230;
                              fStack_1a24 = fVar235;
                              fStack_1a20 = fVar234;
                              fStack_1a1c = fVar258;
                              auVar170._0_4_ = fVar195 * local_1a38 - fVar218 * fVar184;
                              auVar170._4_4_ = fVar223 * fStack_1a34 - fVar205 * fVar185;
                              auVar170._8_4_ = fStack_1b50 * fStack_1a30 - fVar209 * fVar186;
                              auVar170._12_4_ = fStack_1b4c * fStack_1a2c - fVar211 * fVar194;
                              auVar216._0_4_ = fVar218 * fVar214 - auVar182._0_4_ * local_1a38;
                              auVar216._4_4_ = fVar205 * fVar166 - auVar182._4_4_ * fStack_1a34;
                              auVar216._8_4_ = fVar209 * fVar152 - auVar182._8_4_ * fStack_1a30;
                              auVar216._12_4_ = fVar211 * fVar173 - auVar182._12_4_ * fStack_1a2c;
                              auVar89._4_4_ =
                                   -(uint)(ABS(fVar205 * fVar185) <
                                          ABS(auVar182._4_4_ * fStack_1a34));
                              auVar89._0_4_ =
                                   -(uint)(ABS(fVar218 * fVar184) < ABS(auVar182._0_4_ * local_1a38)
                                          );
                              auVar89._8_4_ =
                                   -(uint)(ABS(fVar209 * fVar186) <
                                          ABS(auVar182._8_4_ * fStack_1a30));
                              auVar89._12_4_ =
                                   -(uint)(ABS(fVar211 * fVar194) <
                                          ABS(auVar182._12_4_ * fStack_1a2c));
                              uVar203 = (uint)DAT_01f46710;
                              uVar204 = DAT_01f46710._4_4_;
                              uVar208 = DAT_01f46710._8_4_;
                              uVar210 = DAT_01f46710._12_4_;
                              auVar232 = blendvps(auVar216,auVar170,auVar89);
                              auVar201._0_4_ = fVar68 * local_1a38 - fVar125 * fVar214;
                              auVar201._4_4_ = fVar96 * fStack_1a34 - fVar143 * fVar166;
                              auVar201._8_4_ = fVar97 * fStack_1a30 - fVar154 * fVar152;
                              auVar201._12_4_ = fVar148 * fStack_1a2c - fVar149 * fVar173;
                              auVar90._4_4_ =
                                   -(uint)((float)((uint)(fVar165 * fStack_1a34) & uVar204) <
                                          (float)((uint)(fVar143 * fVar166) & uVar204));
                              auVar90._0_4_ =
                                   -(uint)((float)((uint)(fVar153 * local_1a38) & uVar203) <
                                          (float)((uint)(fVar125 * fVar214) & uVar203));
                              auVar90._8_4_ =
                                   -(uint)((float)((uint)(fVar175 * fStack_1a30) & uVar208) <
                                          (float)((uint)(fVar154 * fVar152) & uVar208));
                              auVar90._12_4_ =
                                   -(uint)((float)((uint)(fVar100 * fStack_1a2c) & uVar210) <
                                          (float)((uint)(fVar149 * fVar173) & uVar210));
                              auVar43._4_4_ = fVar185 * fVar143 - fVar165 * fStack_1a34;
                              auVar43._0_4_ = fVar184 * fVar125 - fVar153 * local_1a38;
                              auVar43._8_4_ = fVar186 * fVar154 - fVar175 * fStack_1a30;
                              auVar43._12_4_ = fVar194 * fVar149 - fVar100 * fStack_1a2c;
                              auVar189 = blendvps(auVar201,auVar43,auVar90);
                              auVar147._0_4_ = fVar153 * fVar218 - fVar125 * fVar195;
                              auVar147._4_4_ = fVar165 * fVar205 - fVar143 * fVar223;
                              auVar147._8_4_ = fVar175 * fVar209 - fVar154 * fStack_1b50;
                              auVar147._12_4_ = fVar100 * fVar211 - fVar149 * fStack_1b4c;
                              auVar225._0_4_ = fVar125 * auVar182._0_4_ - fVar68 * fVar218;
                              auVar225._4_4_ = fVar143 * auVar182._4_4_ - fVar96 * fVar205;
                              auVar225._8_4_ = fVar154 * auVar182._8_4_ - fVar97 * fVar209;
                              auVar225._12_4_ = fVar149 * auVar182._12_4_ - fVar148 * fVar211;
                              auVar91._4_4_ =
                                   -(uint)((float)((uint)(fVar143 * fVar223) & uVar204) <
                                          (float)((uint)(fVar96 * fVar205) & uVar204));
                              auVar91._0_4_ =
                                   -(uint)((float)((uint)(fVar125 * fVar195) & uVar203) <
                                          (float)((uint)(fVar68 * fVar218) & uVar203));
                              auVar91._8_4_ =
                                   -(uint)((float)((uint)(fVar154 * fStack_1b50) & uVar208) <
                                          (float)((uint)(fVar97 * fVar209) & uVar208));
                              auVar91._12_4_ =
                                   -(uint)((float)((uint)(fVar149 * fStack_1b4c) & uVar210) <
                                          (float)((uint)(fVar148 * fVar211) & uVar210));
                              auVar126 = blendvps(auVar225,auVar147,auVar91);
                              fVar214 = (float)local_1c78._0_4_ * auVar232._0_4_ +
                                        (float)local_1c58._0_4_ * auVar189._0_4_ +
                                        fVar213 * auVar126._0_4_;
                              fVar142 = (float)local_1c78._4_4_ * auVar232._4_4_ +
                                        (float)local_1c58._4_4_ * auVar189._4_4_ +
                                        fVar221 * auVar126._4_4_;
                              fVar166 = fStack_1c70 * auVar232._8_4_ +
                                        fStack_1c50 * auVar189._8_4_ + fVar229 * auVar126._8_4_;
                              fVar152 = fStack_1c6c * auVar232._12_4_ +
                                        fStack_1c4c * auVar189._12_4_ + fVar183 * auVar126._12_4_;
                              auVar171._0_4_ = fVar214 + fVar214;
                              auVar171._4_4_ = fVar142 + fVar142;
                              auVar171._8_4_ = fVar166 + fVar166;
                              auVar171._12_4_ = fVar152 + fVar152;
                              auVar113._0_4_ = fVar230 * auVar126._0_4_;
                              auVar113._4_4_ = fVar235 * auVar126._4_4_;
                              auVar113._8_4_ = fVar234 * auVar126._8_4_;
                              auVar113._12_4_ = fVar258 * auVar126._12_4_;
                              fVar166 = local_1a48 * auVar232._0_4_ +
                                        auVar193._0_4_ * auVar189._0_4_ + auVar113._0_4_;
                              fVar152 = fStack_1a44 * auVar232._4_4_ +
                                        auVar193._4_4_ * auVar189._4_4_ + auVar113._4_4_;
                              fVar165 = fStack_1a40 * auVar232._8_4_ +
                                        auVar193._8_4_ * auVar189._8_4_ + auVar113._8_4_;
                              fVar174 = fStack_1a3c * auVar232._12_4_ +
                                        auVar193._12_4_ * auVar189._12_4_ + auVar113._12_4_;
                              auVar177 = rcpps(auVar113,auVar171);
                              fVar214 = auVar177._0_4_;
                              fVar142 = auVar177._4_4_;
                              fVar173 = auVar177._8_4_;
                              fVar153 = auVar177._12_4_;
                              fVar166 = ((1.0 - auVar171._0_4_ * fVar214) * fVar214 + fVar214) *
                                        (fVar166 + fVar166);
                              fVar152 = ((1.0 - auVar171._4_4_ * fVar142) * fVar142 + fVar142) *
                                        (fVar152 + fVar152);
                              fVar173 = ((1.0 - auVar171._8_4_ * fVar173) * fVar173 + fVar173) *
                                        (fVar165 + fVar165);
                              fVar153 = ((1.0 - auVar171._12_4_ * fVar153) * fVar153 + fVar153) *
                                        (fVar174 + fVar174);
                              fVar214 = *(float *)(ray + lVar58 * 4 + 0x80);
                              fVar142 = *(float *)(ray + lVar58 * 4 + 0x30);
                              auVar114._0_4_ =
                                   -(uint)(fVar166 <= fVar214 && fVar142 <= fVar166) &
                                   auVar207._0_4_;
                              auVar114._4_4_ =
                                   -(uint)(fVar152 <= fVar214 && fVar142 <= fVar152) &
                                   auVar207._4_4_;
                              auVar114._8_4_ =
                                   -(uint)(fVar173 <= fVar214 && fVar142 <= fVar173) &
                                   auVar207._8_4_;
                              auVar114._12_4_ =
                                   -(uint)(fVar153 <= fVar214 && fVar142 <= fVar153) &
                                   auVar207._12_4_;
                              uVar202 = movmskps(uVar202,auVar114);
                              pRVar53 = (RTCIntersectArguments *)(ulong)uVar202;
                              _local_1bd8 = auVar193;
                              if (uVar202 != 0) {
                                auVar115._0_4_ = auVar114._0_4_ & -(uint)(auVar171._0_4_ != 0.0);
                                auVar115._4_4_ = auVar114._4_4_ & -(uint)(auVar171._4_4_ != 0.0);
                                auVar115._8_4_ = auVar114._8_4_ & -(uint)(auVar171._8_4_ != 0.0);
                                auVar115._12_4_ = auVar114._12_4_ & -(uint)(auVar171._12_4_ != 0.0);
                                uVar202 = movmskps(uVar202,auVar115);
                                pRVar53 = (RTCIntersectArguments *)(ulong)uVar202;
                                if (uVar202 != 0) {
                                  local_1b28 = _local_1a88;
                                  local_1b18 = &mapUV;
                                  local_1b08 = auVar115;
                                  local_1ad8._4_4_ = fVar152;
                                  local_1ad8._0_4_ = fVar166;
                                  fStack_1ad0 = fVar173;
                                  fStack_1acc = fVar153;
                                  local_1ac8 = auVar232;
                                  local_1ab8 = auVar189;
                                  local_1aa8 = auVar126;
                                  auVar116._4_12_ = auVar115._4_12_;
                                  auVar116._0_4_ =
                                       (float)(int)(*(ushort *)(lVar25 + 8 + lVar60) - 1);
                                  auVar141._0_4_ = (float)local_1a88._0_4_ - (float)local_1a78._0_4_
                                  ;
                                  auVar141._4_4_ = (float)local_1a88._4_4_ - (float)local_1a78._4_4_
                                  ;
                                  auVar141._8_4_ = fStack_1a80 - fStack_1a70;
                                  auVar141._12_4_ = fStack_1a7c - fStack_1a6c;
                                  auVar161._4_4_ = auVar115._4_4_;
                                  auVar161._0_4_ = auVar116._0_4_;
                                  auVar161._8_4_ = auVar115._8_4_;
                                  auVar161._12_4_ = auVar115._12_4_;
                                  auVar177 = rcpss(auVar161,auVar116);
                                  local_1b48[3] =
                                       (2.0 - auVar116._0_4_ * auVar177._0_4_) * auVar177._0_4_;
                                  auVar162._4_12_ = auVar177._4_12_;
                                  auVar162._0_4_ =
                                       (float)(int)(*(ushort *)(lVar25 + 10 + lVar60) - 1);
                                  auVar172._4_4_ = auVar177._4_4_;
                                  auVar172._0_4_ = auVar162._0_4_;
                                  auVar172._8_4_ = auVar177._8_4_;
                                  auVar172._12_4_ = auVar177._12_4_;
                                  auVar177 = rcpss(auVar172,auVar162);
                                  fStack_1b2c = (2.0 - auVar162._0_4_ * auVar177._0_4_) *
                                                auVar177._0_4_;
                                  local_1b48[0] =
                                       local_1b48[3] *
                                       ((float)local_1a88._0_4_ * local_18d8 +
                                       ((float)local_1a88._0_4_ - fVar150));
                                  local_1b48[1] =
                                       local_1b48[3] *
                                       ((float)local_1a88._4_4_ * fStack_18d4 +
                                       ((float)local_1a88._4_4_ - fVar176));
                                  local_1b48[2] =
                                       local_1b48[3] *
                                       (fStack_1a80 * fStack_18d0 + (fStack_1a80 - fStack_1a60));
                                  local_1b48[3] =
                                       local_1b48[3] *
                                       (fStack_1a7c * fStack_18cc + (fStack_1a7c - fStack_1a5c));
                                  local_1b38 = fStack_1b2c *
                                               ((float)local_1a88._0_4_ * local_18e8 +
                                               auVar141._0_4_);
                                  fStack_1b34 = fStack_1b2c *
                                                ((float)local_1a88._4_4_ * fStack_18e4 +
                                                auVar141._4_4_);
                                  fStack_1b30 = fStack_1b2c *
                                                (fStack_1a80 * fStack_18e0 + auVar141._8_4_);
                                  fStack_1b2c = fStack_1b2c *
                                                (fStack_1a7c * fStack_18dc + auVar141._12_4_);
                                  pGVar24 = (context->scene->geometries).items[(long)valid_i].ptr;
                                  if ((pGVar24->mask & *(uint *)(ray + lVar58 * 4 + 0x90)) != 0) {
                                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                       (pGVar24->occlusionFilterN == (RTCFilterFunctionN)0x0))
                                    goto LAB_006e12c1;
                                    auVar177 = rcpps(auVar141,_local_1a88);
                                    fVar142 = auVar177._0_4_;
                                    fVar166 = auVar177._4_4_;
                                    fVar152 = auVar177._8_4_;
                                    fVar173 = auVar177._12_4_;
                                    fVar142 = (float)(-(uint)(1e-18 <= (float)local_1a98) &
                                                     (uint)(((float)DAT_01f46a60 -
                                                            (float)local_1a88._0_4_ * fVar142) *
                                                            fVar142 + fVar142));
                                    fVar166 = (float)(-(uint)(1e-18 <= local_1a98._4_4_) &
                                                     (uint)((DAT_01f46a60._4_4_ -
                                                            (float)local_1a88._4_4_ * fVar166) *
                                                            fVar166 + fVar166));
                                    fVar152 = (float)(-(uint)(1e-18 <= fStack_1a90) &
                                                     (uint)((DAT_01f46a60._8_4_ -
                                                            fStack_1a80 * fVar152) * fVar152 +
                                                           fVar152));
                                    fVar173 = (float)(-(uint)(1e-18 <= fStack_1a8c) &
                                                     (uint)((DAT_01f46a60._12_4_ -
                                                            fStack_1a7c * fVar173) * fVar173 +
                                                           fVar173));
                                    auVar92._0_4_ = local_1b48[0] * fVar142;
                                    auVar92._4_4_ = local_1b48[1] * fVar166;
                                    auVar92._8_4_ = local_1b48[2] * fVar152;
                                    auVar92._12_4_ = local_1b48[3] * fVar173;
                                    local_1af8 = minps(auVar92,_DAT_01f46a60);
                                    auVar117._0_4_ = local_1b38 * fVar142;
                                    auVar117._4_4_ = fStack_1b34 * fVar166;
                                    auVar117._8_4_ = fStack_1b30 * fVar152;
                                    auVar117._12_4_ = fStack_1b2c * fVar173;
                                    local_1ae8 = minps(auVar117,_DAT_01f46a60);
                                    uVar62 = (ulong)(byte)uVar202;
                                    uVar59 = 0;
                                    if (uVar62 != 0) {
                                      for (; ((byte)uVar202 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1
                                          ) {
                                      }
                                    }
                                    pRVar53 = (RTCIntersectArguments *)
                                              ((long)(1 << ((byte)lVar58 & 0x1f)) * 0x10);
                                    auVar49._0_4_ = pRVar53[0x1111fc].flags;
                                    auVar49._4_4_ = pRVar53[0x1111fc].feature_mask;
                                    auVar49._8_8_ = pRVar53[0x1111fc].context;
                                    while (uVar62 != 0) {
                                      local_19a8 = *(undefined4 *)(local_1af8 + uVar59 * 4);
                                      uVar51 = *(undefined4 *)(local_1ae8 + uVar59 * 4);
                                      *(undefined4 *)(ray + lVar58 * 4 + 0x80) =
                                           *(undefined4 *)(local_1ad8 + uVar59 * 4);
                                      args.context = context->user;
                                      local_1998._4_4_ = uVar51;
                                      local_1998._0_4_ = uVar51;
                                      local_1998._8_4_ = uVar51;
                                      local_1998._12_4_ = uVar51;
                                      local_19d8[0] = *(float *)(local_1ac8 + uVar59 * 4);
                                      uVar51 = *(undefined4 *)(local_1ab8 + uVar59 * 4);
                                      uVar19 = *(undefined4 *)(local_1aa8 + uVar59 * 4);
                                      local_19c8._4_4_ = uVar51;
                                      local_19c8._0_4_ = uVar51;
                                      local_19c8._8_4_ = uVar51;
                                      local_19c8._12_4_ = uVar51;
                                      local_19b8._4_4_ = uVar19;
                                      local_19b8._0_4_ = uVar19;
                                      local_19b8._8_4_ = uVar19;
                                      local_19b8._12_4_ = uVar19;
                                      local_19d8[1] = local_19d8[0];
                                      local_19d8[2] = local_19d8[0];
                                      local_19d8[3] = local_19d8[0];
                                      uStack_19a4 = local_19a8;
                                      uStack_19a0 = local_19a8;
                                      uStack_199c = local_19a8;
                                      local_1988 = CONCAT44(uStack_1944,local_1948);
                                      uStack_1980 = CONCAT44(uStack_193c,uStack_1940);
                                      local_1978 = CONCAT44(uStack_1934,local_1938);
                                      uStack_1970 = CONCAT44(uStack_192c,uStack_1930);
                                      local_1968 = (args.context)->instID[0];
                                      uStack_1964 = local_1968;
                                      uStack_1960 = local_1968;
                                      uStack_195c = local_1968;
                                      local_1958 = (args.context)->instPrimID[0];
                                      uStack_1954 = local_1958;
                                      uStack_1950 = local_1958;
                                      uStack_194c = local_1958;
                                      args.valid = (int *)local_1bf8;
                                      args.geometryUserPtr = pGVar24->userPtr;
                                      args.hit = (RTCHitN *)local_19d8;
                                      args.N = 4;
                                      pRVar53 = (RTCIntersectArguments *)pGVar24->occlusionFilterN;
                                      local_1bf8 = auVar49;
                                      args.ray = (RTCRayN *)ray;
                                      if (pRVar53 != (RTCIntersectArguments *)0x0) {
                                        pRVar53 = (RTCIntersectArguments *)(*(code *)pRVar53)(&args)
                                        ;
                                      }
                                      if (local_1bf8 == (undefined1  [16])0x0) {
                                        auVar118._8_4_ = 0xffffffff;
                                        auVar118._0_8_ = 0xffffffffffffffff;
                                        auVar118._12_4_ = 0xffffffff;
                                        auVar118 = auVar118 ^ _DAT_01f46b70;
                                      }
                                      else {
                                        p_Var30 = context->args->filter;
                                        if ((p_Var30 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                                          (*p_Var30)(&args);
                                        }
                                        auVar93._0_4_ = -(uint)(local_1bf8._0_4_ == 0);
                                        auVar93._4_4_ = -(uint)(local_1bf8._4_4_ == 0);
                                        auVar93._8_4_ = -(uint)(local_1bf8._8_4_ == 0);
                                        auVar93._12_4_ = -(uint)(local_1bf8._12_4_ == 0);
                                        auVar118 = auVar93 ^ _DAT_01f46b70;
                                        auVar177 = blendvps(_DAT_01f45a40,
                                                            *(undefined1 (*) [16])(args.ray + 0x80),
                                                            auVar93);
                                        *(undefined1 (*) [16])(args.ray + 0x80) = auVar177;
                                        pRVar53 = (RTCIntersectArguments *)args.ray;
                                      }
                                      if ((_DAT_01f46b40 & auVar118) != (undefined1  [16])0x0)
                                      goto LAB_006e12c1;
                                      *(float *)(ray + lVar58 * 4 + 0x80) = fVar214;
                                      uVar62 = uVar62 ^ 1L << (uVar59 & 0x3f);
                                      uVar59 = 0;
                                      if (uVar62 != 0) {
                                        for (; (uVar62 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            iVar240 = 0x7f800000;
                            iVar243 = 0x7f800000;
                            iVar246 = 0x7f800000;
                            iVar249 = 0x7f800000;
                          }
                          else {
                            auVar255._0_4_ = fVar152 * fVar242 - fVar205 * (float)local_1a88._0_4_;
                            auVar255._4_4_ = fVar173 * fVar245 - fVar209 * (float)local_1a88._4_4_;
                            auVar255._8_4_ = fVar153 * fVar248 - fVar211 * fStack_1a80;
                            auVar255._12_4_ = fVar165 * fVar251 - fVar213 * fStack_1a7c;
                            auVar82._4_4_ =
                                 -(uint)(ABS(fVar173 * (float)local_1a68._4_4_) <
                                        ABS(fVar209 * (float)local_1a88._4_4_));
                            auVar82._0_4_ =
                                 -(uint)(ABS(fVar152 * (float)local_1a68._0_4_) <
                                        ABS(fVar205 * (float)local_1a88._0_4_));
                            auVar82._8_4_ =
                                 -(uint)(ABS(fVar153 * fStack_1a60) < ABS(fVar211 * fStack_1a80));
                            auVar82._12_4_ =
                                 -(uint)(ABS(fVar165 * fStack_1a5c) < ABS(fVar213 * fStack_1a7c));
                            auVar42._4_4_ =
                                 (float)local_1a78._4_4_ * (float)local_1a88._4_4_ -
                                 fVar173 * (float)local_1a68._4_4_;
                            auVar42._0_4_ =
                                 (float)local_1a78._0_4_ * (float)local_1a88._0_4_ -
                                 fVar152 * (float)local_1a68._0_4_;
                            auVar42._8_4_ = fStack_1a70 * fStack_1a80 - fVar153 * fStack_1a60;
                            auVar42._12_4_ = fStack_1a6c * fStack_1a7c - fVar165 * fStack_1a5c;
                            auVar126 = blendvps(auVar255,auVar42,auVar82);
                            auVar224._0_4_ =
                                 (float)local_1a68._0_4_ * fVar230 -
                                 (float)local_1a58._0_4_ * (float)local_1a88._0_4_;
                            auVar224._4_4_ =
                                 (float)local_1a68._4_4_ * fVar234 -
                                 (float)local_1a58._4_4_ * (float)local_1a88._4_4_;
                            auVar224._8_4_ = fStack_1a60 * fVar236 - fStack_1a50 * fStack_1a80;
                            auVar224._12_4_ = fStack_1a5c * fVar237 - fStack_1a4c * fStack_1a7c;
                            auVar181._0_4_ = fVar184 * (float)local_1a88._0_4_ - fVar230 * fVar242;
                            auVar181._4_4_ = fVar186 * (float)local_1a88._4_4_ - fVar234 * fVar245;
                            auVar181._8_4_ = fVar195 * fStack_1a80 - fVar236 * fVar248;
                            auVar181._12_4_ = fVar223 * fStack_1a7c - fVar237 * fVar251;
                            auVar83._4_4_ =
                                 -(uint)(ABS((float)local_1a58._4_4_ * (float)local_1a88._4_4_) <
                                        ABS(fVar234 * fVar245));
                            auVar83._0_4_ =
                                 -(uint)(ABS((float)local_1a58._0_4_ * (float)local_1a88._0_4_) <
                                        ABS(fVar230 * fVar242));
                            auVar83._8_4_ =
                                 -(uint)(ABS(fStack_1a50 * fStack_1a80) < ABS(fVar236 * fVar248));
                            auVar83._12_4_ =
                                 -(uint)(ABS(fStack_1a4c * fStack_1a7c) < ABS(fVar237 * fVar251));
                            auVar189 = blendvps(auVar181,auVar224,auVar83);
                            auVar192._0_4_ =
                                 (float)local_1a58._0_4_ * fVar152 -
                                 fVar230 * (float)local_1a78._0_4_;
                            auVar192._4_4_ =
                                 (float)local_1a58._4_4_ * fVar173 -
                                 fVar234 * (float)local_1a78._4_4_;
                            auVar192._8_4_ = fStack_1a50 * fVar153 - fVar236 * fStack_1a70;
                            auVar192._12_4_ = fStack_1a4c * fVar165 - fVar237 * fStack_1a6c;
                            auVar231._0_4_ = fVar230 * fVar205 - fVar184 * fVar152;
                            auVar231._4_4_ = fVar234 * fVar209 - fVar186 * fVar173;
                            auVar231._8_4_ = fVar236 * fVar211 - fVar195 * fVar153;
                            auVar231._12_4_ = fVar237 * fVar213 - fVar223 * fVar165;
                            auVar84._4_4_ =
                                 -(uint)(ABS(fVar234 * (float)local_1a78._4_4_) <
                                        ABS(fVar186 * fVar173));
                            auVar84._0_4_ =
                                 -(uint)(ABS(fVar230 * (float)local_1a78._0_4_) <
                                        ABS(fVar184 * fVar152));
                            auVar84._8_4_ =
                                 -(uint)(ABS(fVar236 * fStack_1a70) < ABS(fVar195 * fVar153));
                            auVar84._12_4_ =
                                 -(uint)(ABS(fVar237 * fStack_1a6c) < ABS(fVar223 * fVar165));
                            auVar232 = blendvps(auVar231,auVar192,auVar84);
                            fVar166 = (float)local_1c78._4_4_ * auVar126._0_4_ +
                                      (float)local_1c58._4_4_ * auVar189._0_4_ +
                                      fStack_1c34 * auVar232._0_4_;
                            fVar152 = (float)local_1c78._4_4_ * auVar126._4_4_ +
                                      (float)local_1c58._4_4_ * auVar189._4_4_ +
                                      fStack_1c34 * auVar232._4_4_;
                            fVar173 = (float)local_1c78._4_4_ * auVar126._8_4_ +
                                      (float)local_1c58._4_4_ * auVar189._8_4_ +
                                      fStack_1c34 * auVar232._8_4_;
                            fVar153 = (float)local_1c78._4_4_ * auVar126._12_4_ +
                                      (float)local_1c58._4_4_ * auVar189._12_4_ +
                                      fStack_1c34 * auVar232._12_4_;
                            auVar85._0_4_ = fVar166 + fVar166;
                            auVar85._4_4_ = fVar152 + fVar152;
                            auVar85._8_4_ = fVar173 + fVar173;
                            auVar85._12_4_ = fVar153 + fVar153;
                            auVar135._0_4_ = local_1a48 * auVar189._0_4_ + fVar183 * auVar232._0_4_;
                            auVar135._4_4_ = fStack_1a44 * auVar189._4_4_ + fVar185 * auVar232._4_4_
                            ;
                            auVar135._8_4_ = fStack_1a40 * auVar189._8_4_ + fVar194 * auVar232._8_4_
                            ;
                            auVar135._12_4_ =
                                 fStack_1a3c * auVar189._12_4_ + fVar218 * auVar232._12_4_;
                            fVar165 = local_1a38 * auVar126._0_4_ + auVar135._0_4_;
                            fVar100 = fStack_1a34 * auVar126._4_4_ + auVar135._4_4_;
                            fVar154 = fStack_1a30 * auVar126._8_4_ + auVar135._8_4_;
                            fVar151 = fStack_1a2c * auVar126._12_4_ + auVar135._12_4_;
                            auVar177 = rcpps(auVar135,auVar85);
                            fVar166 = auVar177._0_4_;
                            fVar152 = auVar177._4_4_;
                            fVar173 = auVar177._8_4_;
                            fVar153 = auVar177._12_4_;
                            auVar107._0_4_ =
                                 ((1.0 - auVar85._0_4_ * fVar166) * fVar166 + fVar166) *
                                 (fVar165 + fVar165);
                            auVar107._4_4_ =
                                 ((1.0 - auVar85._4_4_ * fVar152) * fVar152 + fVar152) *
                                 (fVar100 + fVar100);
                            auVar107._8_4_ =
                                 ((1.0 - auVar85._8_4_ * fVar173) * fVar173 + fVar173) *
                                 (fVar154 + fVar154);
                            auVar107._12_4_ =
                                 ((1.0 - auVar85._12_4_ * fVar153) * fVar153 + fVar153) *
                                 (fVar151 + fVar151);
                            fVar166 = *(float *)(ray + lVar58 * 4 + 0x80);
                            fVar152 = *(float *)(ray + lVar58 * 4 + 0x30);
                            iVar243 = -(uint)(fVar152 <= auVar107._4_4_);
                            iVar246 = -(uint)(fVar152 <= auVar107._8_4_);
                            iVar249 = -(uint)(fVar152 <= auVar107._12_4_);
                            auVar160._8_4_ = iVar246;
                            auVar160._4_4_ = iVar243;
                            auVar160._12_4_ = iVar249;
                            auVar136._0_4_ =
                                 -(uint)(auVar107._0_4_ <= fVar166 && fVar152 <= auVar107._0_4_) &
                                 auVar200._0_4_;
                            auVar136._4_4_ =
                                 -(uint)(auVar107._4_4_ <= fVar166 && fVar152 <= auVar107._4_4_) &
                                 auVar200._4_4_;
                            auVar136._8_4_ =
                                 -(uint)(auVar107._8_4_ <= fVar166 && fVar152 <= auVar107._8_4_) &
                                 auVar200._8_4_;
                            auVar136._12_4_ =
                                 -(uint)(auVar107._12_4_ <= fVar166 && fVar152 <= auVar107._12_4_) &
                                 auVar200._12_4_;
                            uVar202 = movmskps(iVar240,auVar136);
                            if (uVar202 == 0) goto LAB_006e0d1e;
                            auVar137._0_4_ = auVar136._0_4_ & -(uint)(auVar85._0_4_ != 0.0);
                            auVar137._4_4_ = auVar136._4_4_ & -(uint)(auVar85._4_4_ != 0.0);
                            auVar137._8_4_ = auVar136._8_4_ & -(uint)(auVar85._8_4_ != 0.0);
                            auVar137._12_4_ = auVar136._12_4_ & -(uint)(auVar85._12_4_ != 0.0);
                            uVar203 = movmskps((int)lVar27,auVar137);
                            if (uVar203 == 0) goto LAB_006e0d1e;
                            local_1b28._4_4_ = fVar175;
                            local_1b28._0_4_ = fVar142;
                            local_1b28._8_4_ = fVar143;
                            local_1b28._12_4_ = fVar149;
                            local_1b18 = &mapUV;
                            local_1b08 = auVar137;
                            _local_1ad8 = auVar107;
                            local_1ac8 = auVar126;
                            local_1ab8 = auVar189;
                            local_1aa8 = auVar232;
                            auVar108._4_12_ = auVar107._4_12_;
                            auVar108._0_4_ = (float)(int)(*(ushort *)(lVar25 + 8 + lVar60) - 1);
                            auVar138._4_4_ = auVar107._4_4_;
                            auVar138._0_4_ = auVar108._0_4_;
                            auVar138._8_4_ = auVar107._8_4_;
                            auVar138._12_4_ = auVar107._12_4_;
                            auVar177 = rcpss(auVar138,auVar108);
                            auVar160._0_4_ = (float)(int)(*(ushort *)(lVar25 + 10 + lVar60) - 1);
                            local_1b48[3] = (2.0 - auVar108._0_4_ * auVar177._0_4_) * auVar177._0_4_
                            ;
                            auVar139._4_4_ = iVar243;
                            auVar139._0_4_ = auVar160._0_4_;
                            auVar139._8_4_ = iVar246;
                            auVar139._12_4_ = iVar249;
                            auVar177 = rcpss(auVar139,auVar160);
                            fVar152 = (2.0 - auVar160._0_4_ * auVar177._0_4_) * auVar177._0_4_;
                            local_1b48[0] = local_1b48[3] * (fVar68 + fVar142 * local_18d8);
                            local_1b48[1] = local_1b48[3] * (fVar96 + fVar175 * fStack_18d4);
                            local_1b48[2] = local_1b48[3] * (fVar148 + fVar143 * fStack_18d0);
                            local_1b48[3] = local_1b48[3] * (fVar150 + fVar149 * fStack_18cc);
                            auVar140._0_4_ = fVar142 * local_18e8 + auVar191._0_4_;
                            auVar140._4_4_ = fVar175 * fStack_18e4 + auVar191._4_4_;
                            auVar140._8_4_ = fVar143 * fStack_18e0 + auVar191._8_4_;
                            auVar140._12_4_ = fVar149 * fStack_18dc + auVar191._12_4_;
                            local_1b38 = fVar152 * auVar140._0_4_;
                            fStack_1b34 = fVar152 * auVar140._4_4_;
                            fStack_1b30 = fVar152 * auVar140._8_4_;
                            fStack_1b2c = fVar152 * auVar140._12_4_;
                            pGVar24 = (local_1a98->geometries).items[(long)valid_i].ptr;
                            uVar202 = *(uint *)(ray + lVar58 * 4 + 0x90);
                            if ((pGVar24->mask & uVar202) == 0) goto LAB_006e0d1e;
                            pRVar53 = context->args;
                            if ((pRVar53->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar177 = rcpps(auVar140,local_1b28);
                              fVar173 = auVar177._0_4_;
                              fVar153 = auVar177._4_4_;
                              fVar165 = auVar177._8_4_;
                              fVar100 = auVar177._12_4_;
                              fVar142 = (float)(-(uint)(1e-18 <= ABS(fVar142)) &
                                               (uint)(((float)DAT_01f46a60 - fVar142 * fVar173) *
                                                      fVar173 + fVar173));
                              fVar173 = (float)(-(uint)(1e-18 <= ABS(fVar175)) &
                                               (uint)((DAT_01f46a60._4_4_ - fVar175 * fVar153) *
                                                      fVar153 + fVar153));
                              fVar153 = (float)(-(uint)(1e-18 <= ABS(fVar143)) &
                                               (uint)((DAT_01f46a60._8_4_ - fVar143 * fVar165) *
                                                      fVar165 + fVar165));
                              fVar165 = (float)(-(uint)(1e-18 <= ABS(fVar149)) &
                                               (uint)((DAT_01f46a60._12_4_ - fVar149 * fVar100) *
                                                      fVar100 + fVar100));
                              auVar86._0_4_ = local_1b48[0] * fVar142;
                              auVar86._4_4_ = local_1b48[1] * fVar173;
                              auVar86._8_4_ = local_1b48[2] * fVar153;
                              auVar86._12_4_ = local_1b48[3] * fVar165;
                              local_1af8 = minps(auVar86,_DAT_01f46a60);
                              auVar109._0_4_ = fVar152 * auVar140._0_4_ * fVar142;
                              auVar109._4_4_ = fVar152 * auVar140._4_4_ * fVar173;
                              auVar109._8_4_ = fVar152 * auVar140._8_4_ * fVar153;
                              auVar109._12_4_ = fVar152 * auVar140._12_4_ * fVar165;
                              local_1ae8 = minps(auVar109,_DAT_01f46a60);
                              uVar62 = (ulong)(uVar203 & 0xff);
                              uVar59 = 0;
                              if (uVar62 != 0) {
                                for (; ((uVar203 & 0xff) >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                                }
                              }
                              pRVar53 = (RTCIntersectArguments *)
                                        ((long)(1 << ((byte)lVar58 & 0x1f)) * 0x10);
                              auVar48._0_4_ = pRVar53[0x1111fc].flags;
                              auVar48._4_4_ = pRVar53[0x1111fc].feature_mask;
                              auVar48._8_8_ = pRVar53[0x1111fc].context;
                              while (uVar202 = (uint)pRVar53, uVar62 != 0) {
                                local_19a8 = *(undefined4 *)(local_1af8 + uVar59 * 4);
                                uVar51 = *(undefined4 *)(local_1ae8 + uVar59 * 4);
                                *(undefined4 *)(ray + lVar58 * 4 + 0x80) =
                                     *(undefined4 *)(local_1ad8 + uVar59 * 4);
                                args.context = context->user;
                                local_1998._4_4_ = uVar51;
                                local_1998._0_4_ = uVar51;
                                local_1998._8_4_ = uVar51;
                                local_1998._12_4_ = uVar51;
                                local_19d8[0] = *(float *)(local_1ac8 + uVar59 * 4);
                                local_19c8._4_4_ = *(undefined4 *)(local_1ab8 + uVar59 * 4);
                                uVar51 = *(undefined4 *)(local_1aa8 + uVar59 * 4);
                                local_19b8._4_4_ = uVar51;
                                local_19b8._0_4_ = uVar51;
                                local_19b8._8_4_ = uVar51;
                                local_19b8._12_4_ = uVar51;
                                local_19d8[1] = local_19d8[0];
                                local_19d8[2] = local_19d8[0];
                                local_19d8[3] = local_19d8[0];
                                local_19c8._0_4_ = local_19c8._4_4_;
                                local_19c8._8_4_ = local_19c8._4_4_;
                                local_19c8._12_4_ = local_19c8._4_4_;
                                uStack_19a4 = local_19a8;
                                uStack_19a0 = local_19a8;
                                uStack_199c = local_19a8;
                                local_1988 = CONCAT44(uStack_1944,local_1948);
                                uStack_1980 = CONCAT44(uStack_193c,uStack_1940);
                                local_1978 = CONCAT44(uStack_1934,local_1938);
                                uStack_1970 = CONCAT44(uStack_192c,uStack_1930);
                                local_1968 = (args.context)->instID[0];
                                uStack_1964 = local_1968;
                                uStack_1960 = local_1968;
                                uStack_195c = local_1968;
                                local_1958 = (args.context)->instPrimID[0];
                                uStack_1954 = local_1958;
                                uStack_1950 = local_1958;
                                uStack_194c = local_1958;
                                args.valid = (int *)local_1bf8;
                                args.geometryUserPtr = pGVar24->userPtr;
                                args.hit = (RTCHitN *)local_19d8;
                                args.N = 4;
                                pRVar53 = (RTCIntersectArguments *)pGVar24->occlusionFilterN;
                                local_1bf8 = auVar48;
                                args.ray = (RTCRayN *)ray;
                                if (pRVar53 != (RTCIntersectArguments *)0x0) {
                                  pRVar53 = (RTCIntersectArguments *)(*(code *)pRVar53)(&args);
                                }
                                if (local_1bf8 == (undefined1  [16])0x0) {
                                  auVar110._8_4_ = 0xffffffff;
                                  auVar110._0_8_ = 0xffffffffffffffff;
                                  auVar110._12_4_ = 0xffffffff;
                                  auVar110 = auVar110 ^ _DAT_01f46b70;
                                }
                                else {
                                  p_Var30 = context->args->filter;
                                  if ((p_Var30 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var30)(&args);
                                  }
                                  auVar87._0_4_ = -(uint)(local_1bf8._0_4_ == 0);
                                  auVar87._4_4_ = -(uint)(local_1bf8._4_4_ == 0);
                                  auVar87._8_4_ = -(uint)(local_1bf8._8_4_ == 0);
                                  auVar87._12_4_ = -(uint)(local_1bf8._12_4_ == 0);
                                  auVar110 = auVar87 ^ _DAT_01f46b70;
                                  auVar177 = blendvps(_DAT_01f45a40,
                                                      *(undefined1 (*) [16])(args.ray + 0x80),
                                                      auVar87);
                                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar177;
                                  pRVar53 = (RTCIntersectArguments *)args.ray;
                                }
                                if ((_DAT_01f46b40 & auVar110) != (undefined1  [16])0x0)
                                goto LAB_006e12c1;
                                *(float *)(ray + lVar58 * 4 + 0x80) = fVar166;
                                uVar62 = uVar62 ^ 1L << (uVar59 & 0x3f);
                                uVar59 = 0;
                                if (uVar62 != 0) {
                                  for (; (uVar62 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                                  }
                                }
                              }
                              local_1918 = *(float *)(ray + lVar58 * 4 + 0x20);
                              uVar51 = *(undefined4 *)(ray + lVar58 * 4 + 0x40);
                              uVar19 = *(undefined4 *)(ray + lVar58 * 4 + 0x50);
                              uVar20 = *(undefined4 *)(ray + lVar58 * 4 + 0x60);
                              local_1c78._4_4_ = uVar51;
                              local_1c78._0_4_ = uVar51;
                              fStack_1c70 = (float)uVar51;
                              fStack_1c6c = (float)uVar51;
                              local_1c58._4_4_ = uVar19;
                              local_1c58._0_4_ = uVar19;
                              fStack_1c50 = (float)uVar19;
                              fStack_1c4c = (float)uVar19;
                              fStack_1c34 = (float)uVar20;
                              old_t = (float)uVar20;
                              fStack_1c30 = (float)uVar20;
                              fStack_1c2c = (float)uVar20;
                              fStack_18ec = fVar97 - local_1918;
                              fStack_1914 = local_1918;
                              fStack_1910 = local_1918;
                              fStack_190c = local_1918;
                              fStack_1924 = fVar125 - local_1918;
                              local_1908 = (fVar239 - local_1918) + (fVar176 - local_1918);
                              fStack_1904 = (fVar221 - local_1918) + fStack_1924;
                              fStack_1900 = (fVar258 - local_1918) + (fStack_1b50 - local_1918);
                              fStack_18fc = fStack_18ec + (fStack_1b4c - local_1918);
                              local_1928 = fVar176 - local_1918;
                              fStack_1920 = fStack_1b50 - local_1918;
                              fStack_191c = fStack_1b4c - local_1918;
                              local_18f8 = fVar239 - local_1918;
                              fStack_18f4 = fVar221 - local_1918;
                              fStack_18f0 = fVar258 - local_1918;
                              goto LAB_006e0d1e;
                            }
LAB_006e12c1:
                            iVar249 = 0x7f800000;
                            iVar246 = 0x7f800000;
                            iVar243 = 0x7f800000;
                            iVar240 = 0x7f800000;
                            valid0.field_0.v[lVar58] = 0.0;
                          }
                        }
                        local_1b68.i[0] = local_1b68.i[0] & valid0.field_0.i[0];
                        local_1b68.i[1] = uVar226 & valid0.field_0.i[1];
                        local_1b68.i[2] = uVar227 & valid0.field_0.i[2];
                        local_1b68.i[3] = uVar228 & valid0.field_0.i[3];
                        iVar55 = movmskps((int)pRVar53,(undefined1  [16])local_1b68);
                        bVar67 = iVar55 == 0;
                        in_R9 = (RayK<4> *)0x0;
                        sVar56 = local_19f8;
                      }
                    } while ((!bVar67) && (uVar57 = local_19f0 & local_19f0 - 1, uVar57 != 0));
                  }
                  lVar58 = local_1a00 + 1;
                }
                auVar94._0_8_ = CONCAT44(local_1b68.i[1],local_1b68.i[0]) ^ 0xffffffffffffffff;
                auVar94._8_4_ = local_1b68.i[2] ^ 0xffffffff;
                auVar94._12_4_ = local_1b68.i[3] ^ 0xffffffff;
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     (auVar94 | (undefined1  [16])terminated.field_0);
                uVar226 = movmskps((int)lVar58,(undefined1  [16])terminated.field_0);
                if (uVar226 == 0xf) goto LAB_006e170b;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_006df8db;
            }
            uVar52 = root.ptr & 0xfffffffffffffff0;
            uVar226 = (uint)root.ptr & 7;
            sVar56 = (size_t)uVar226;
            lVar58 = -0x10;
            aVar254.i[1] = iVar243;
            aVar254.i[0] = iVar240;
            aVar254.i[2] = iVar246;
            aVar254.i[3] = iVar249;
            root.ptr = 8;
            while( true ) {
              if ((lVar58 == 0) || (sVar23 = *(size_t *)(uVar52 + 0x20 + lVar58 * 2), sVar23 == 8))
              break;
              fVar98 = *(float *)(uVar52 + 0x90 + lVar58);
              fVar142 = *(float *)(uVar52 + 0x30 + lVar58);
              fVar166 = *(float *)(uVar52 + 0x40 + lVar58);
              fVar152 = *(float *)(uVar52 + 0x50 + lVar58);
              fVar173 = *(float *)(uVar52 + 0x60 + lVar58);
              fVar143 = *(float *)(ray + 0x70);
              fVar154 = *(float *)(ray + 0x74);
              fVar149 = *(float *)(ray + 0x78);
              fVar151 = *(float *)(ray + 0x7c);
              fVar153 = *(float *)(uVar52 + 0xb0 + lVar58);
              fVar165 = *(float *)(uVar52 + 0xd0 + lVar58);
              fVar174 = *(float *)(uVar52 + 0x70 + lVar58);
              fVar175 = *(float *)(uVar52 + 0xa0 + lVar58);
              fVar196 = *(float *)(uVar52 + 0xc0 + lVar58);
              fVar100 = *(float *)(uVar52 + 0xe0 + lVar58);
              fVar125 = *(float *)(uVar52 + 0x80 + lVar58);
              fVar218 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
              fVar223 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
              fVar68 = ((fVar98 * fVar143 + fVar142) - (float)tray.org.field_0._0_4_) *
                       tray.rdir.field_0._0_4_;
              fVar96 = ((fVar98 * fVar154 + fVar142) - (float)tray.org.field_0._4_4_) *
                       tray.rdir.field_0._4_4_;
              fVar97 = ((fVar98 * fVar149 + fVar142) - (float)tray.org.field_0._8_4_) *
                       tray.rdir.field_0._8_4_;
              fVar98 = ((fVar98 * fVar151 + fVar142) - (float)tray.org.field_0._12_4_) *
                       tray.rdir.field_0._12_4_;
              fVar142 = ((fVar153 * fVar143 + fVar152) - (float)tray.org.field_0._16_4_) *
                        tray.rdir.field_0._16_4_;
              fVar148 = ((fVar153 * fVar154 + fVar152) - (float)tray.org.field_0._20_4_) *
                        tray.rdir.field_0._20_4_;
              fVar150 = ((fVar153 * fVar149 + fVar152) - (float)tray.org.field_0._24_4_) *
                        tray.rdir.field_0._24_4_;
              fVar152 = ((fVar153 * fVar151 + fVar152) - (float)tray.org.field_0._28_4_) *
                        tray.rdir.field_0._28_4_;
              fVar153 = ((fVar165 * fVar143 + fVar174) - (float)tray.org.field_0._32_8_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar163 = ((fVar165 * fVar154 + fVar174) - fVar218) * (float)tray.rdir.field_0._36_4_;
              fVar164 = ((fVar165 * fVar149 + fVar174) - (float)tray.org.field_0._40_8_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar165 = ((fVar165 * fVar151 + fVar174) - fVar223) * (float)tray.rdir.field_0._44_4_;
              fVar176 = ((fVar175 * fVar143 + fVar166) - (float)tray.org.field_0._0_4_) *
                        tray.rdir.field_0._0_4_;
              fVar183 = ((fVar175 * fVar154 + fVar166) - (float)tray.org.field_0._4_4_) *
                        tray.rdir.field_0._4_4_;
              fVar184 = ((fVar175 * fVar149 + fVar166) - (float)tray.org.field_0._8_4_) *
                        tray.rdir.field_0._8_4_;
              fVar185 = ((fVar175 * fVar151 + fVar166) - (float)tray.org.field_0._12_4_) *
                        tray.rdir.field_0._12_4_;
              fVar186 = ((fVar196 * fVar143 + fVar173) - (float)tray.org.field_0._16_4_) *
                        tray.rdir.field_0._16_4_;
              fVar194 = ((fVar196 * fVar154 + fVar173) - (float)tray.org.field_0._20_4_) *
                        tray.rdir.field_0._20_4_;
              fVar195 = ((fVar196 * fVar149 + fVar173) - (float)tray.org.field_0._24_4_) *
                        tray.rdir.field_0._24_4_;
              fVar196 = ((fVar196 * fVar151 + fVar173) - (float)tray.org.field_0._28_4_) *
                        tray.rdir.field_0._28_4_;
              fVar166 = ((fVar100 * fVar143 + fVar125) - (float)tray.org.field_0._32_8_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar173 = ((fVar100 * fVar154 + fVar125) - fVar218) * (float)tray.rdir.field_0._36_4_;
              fVar174 = ((fVar100 * fVar149 + fVar125) - (float)tray.org.field_0._40_8_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar175 = ((fVar100 * fVar151 + fVar125) - fVar223) * (float)tray.rdir.field_0._44_4_;
              uVar227 = (uint)((int)fVar176 < (int)fVar68) * (int)fVar176 |
                        (uint)((int)fVar176 >= (int)fVar68) * (int)fVar68;
              uVar228 = (uint)((int)fVar183 < (int)fVar96) * (int)fVar183 |
                        (uint)((int)fVar183 >= (int)fVar96) * (int)fVar96;
              uVar202 = (uint)((int)fVar184 < (int)fVar97) * (int)fVar184 |
                        (uint)((int)fVar184 >= (int)fVar97) * (int)fVar97;
              uVar203 = (uint)((int)fVar185 < (int)fVar98) * (int)fVar185 |
                        (uint)((int)fVar185 >= (int)fVar98) * (int)fVar98;
              uVar204 = (uint)((int)fVar186 < (int)fVar142) * (int)fVar186 |
                        (uint)((int)fVar186 >= (int)fVar142) * (int)fVar142;
              uVar208 = (uint)((int)fVar194 < (int)fVar148) * (int)fVar194 |
                        (uint)((int)fVar194 >= (int)fVar148) * (int)fVar148;
              uVar210 = (uint)((int)fVar195 < (int)fVar150) * (int)fVar195 |
                        (uint)((int)fVar195 >= (int)fVar150) * (int)fVar150;
              uVar212 = (uint)((int)fVar196 < (int)fVar152) * (int)fVar196 |
                        (uint)((int)fVar196 >= (int)fVar152) * (int)fVar152;
              uVar204 = ((int)uVar204 < (int)uVar227) * uVar227 |
                        ((int)uVar204 >= (int)uVar227) * uVar204;
              uVar208 = ((int)uVar208 < (int)uVar228) * uVar228 |
                        ((int)uVar208 >= (int)uVar228) * uVar208;
              uVar210 = ((int)uVar210 < (int)uVar202) * uVar202 |
                        ((int)uVar210 >= (int)uVar202) * uVar210;
              uVar212 = ((int)uVar212 < (int)uVar203) * uVar203 |
                        ((int)uVar212 >= (int)uVar203) * uVar212;
              uVar227 = (uint)((int)fVar166 < (int)fVar153) * (int)fVar166 |
                        (uint)((int)fVar166 >= (int)fVar153) * (int)fVar153;
              uVar228 = (uint)((int)fVar173 < (int)fVar163) * (int)fVar173 |
                        (uint)((int)fVar173 >= (int)fVar163) * (int)fVar163;
              uVar202 = (uint)((int)fVar174 < (int)fVar164) * (int)fVar174 |
                        (uint)((int)fVar174 >= (int)fVar164) * (int)fVar164;
              uVar203 = (uint)((int)fVar175 < (int)fVar165) * (int)fVar175 |
                        (uint)((int)fVar175 >= (int)fVar165) * (int)fVar165;
              auVar198._0_4_ =
                   (float)(((int)uVar227 < (int)uVar204) * uVar204 |
                          ((int)uVar227 >= (int)uVar204) * uVar227) * 0.99999964;
              auVar198._4_4_ =
                   (float)(((int)uVar228 < (int)uVar208) * uVar208 |
                          ((int)uVar228 >= (int)uVar208) * uVar228) * 0.99999964;
              auVar198._8_4_ =
                   (float)(((int)uVar202 < (int)uVar210) * uVar210 |
                          ((int)uVar202 >= (int)uVar210) * uVar202) * 0.99999964;
              auVar198._12_4_ =
                   (float)(((int)uVar203 < (int)uVar212) * uVar212 |
                          ((int)uVar203 >= (int)uVar212) * uVar203) * 0.99999964;
              uVar227 = (uint)((int)fVar176 < (int)fVar68) * (int)fVar68 |
                        (uint)((int)fVar176 >= (int)fVar68) * (int)fVar176;
              uVar228 = (uint)((int)fVar183 < (int)fVar96) * (int)fVar96 |
                        (uint)((int)fVar183 >= (int)fVar96) * (int)fVar183;
              uVar202 = (uint)((int)fVar184 < (int)fVar97) * (int)fVar97 |
                        (uint)((int)fVar184 >= (int)fVar97) * (int)fVar184;
              uVar203 = (uint)((int)fVar185 < (int)fVar98) * (int)fVar98 |
                        (uint)((int)fVar185 >= (int)fVar98) * (int)fVar185;
              uVar204 = (uint)((int)fVar186 < (int)fVar142) * (int)fVar142 |
                        (uint)((int)fVar186 >= (int)fVar142) * (int)fVar186;
              uVar208 = (uint)((int)fVar194 < (int)fVar148) * (int)fVar148 |
                        (uint)((int)fVar194 >= (int)fVar148) * (int)fVar194;
              uVar210 = (uint)((int)fVar195 < (int)fVar150) * (int)fVar150 |
                        (uint)((int)fVar195 >= (int)fVar150) * (int)fVar195;
              uVar212 = (uint)((int)fVar196 < (int)fVar152) * (int)fVar152 |
                        (uint)((int)fVar196 >= (int)fVar152) * (int)fVar196;
              uVar204 = ((int)uVar227 < (int)uVar204) * uVar227 |
                        ((int)uVar227 >= (int)uVar204) * uVar204;
              uVar208 = ((int)uVar228 < (int)uVar208) * uVar228 |
                        ((int)uVar228 >= (int)uVar208) * uVar208;
              uVar210 = ((int)uVar202 < (int)uVar210) * uVar202 |
                        ((int)uVar202 >= (int)uVar210) * uVar210;
              uVar212 = ((int)uVar203 < (int)uVar212) * uVar203 |
                        ((int)uVar203 >= (int)uVar212) * uVar212;
              uVar227 = (uint)((int)fVar166 < (int)fVar153) * (int)fVar153 |
                        (uint)((int)fVar166 >= (int)fVar153) * (int)fVar166;
              uVar228 = (uint)((int)fVar173 < (int)fVar163) * (int)fVar163 |
                        (uint)((int)fVar173 >= (int)fVar163) * (int)fVar173;
              uVar202 = (uint)((int)fVar174 < (int)fVar164) * (int)fVar164 |
                        (uint)((int)fVar174 >= (int)fVar164) * (int)fVar174;
              uVar203 = (uint)((int)fVar175 < (int)fVar165) * (int)fVar165 |
                        (uint)((int)fVar175 >= (int)fVar165) * (int)fVar175;
              fVar98 = (float)(((int)uVar204 < (int)uVar227) * uVar204 |
                              ((int)uVar204 >= (int)uVar227) * uVar227) * 1.0000004;
              fVar142 = (float)(((int)uVar208 < (int)uVar228) * uVar208 |
                               ((int)uVar208 >= (int)uVar228) * uVar228) * 1.0000004;
              fVar166 = (float)(((int)uVar210 < (int)uVar202) * uVar210 |
                               ((int)uVar210 >= (int)uVar202) * uVar202) * 1.0000004;
              fVar152 = (float)(((int)uVar212 < (int)uVar203) * uVar212 |
                               ((int)uVar212 >= (int)uVar203) * uVar203) * 1.0000004;
              bVar67 = (float)((uint)(tray.tnear.field_0.i[0] < (int)auVar198._0_4_) *
                               (int)auVar198._0_4_ |
                              (uint)(tray.tnear.field_0.i[0] >= (int)auVar198._0_4_) *
                              tray.tnear.field_0.i[0]) <=
                       (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar98) * tray.tfar.field_0.i[0]
                              | (uint)(tray.tfar.field_0.i[0] >= (int)fVar98) * (int)fVar98);
              bVar31 = (float)((uint)(tray.tnear.field_0.i[1] < (int)auVar198._4_4_) *
                               (int)auVar198._4_4_ |
                              (uint)(tray.tnear.field_0.i[1] >= (int)auVar198._4_4_) *
                              tray.tnear.field_0.i[1]) <=
                       (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar142) *
                               tray.tfar.field_0.i[1] |
                              (uint)(tray.tfar.field_0.i[1] >= (int)fVar142) * (int)fVar142);
              bVar32 = (float)((uint)(tray.tnear.field_0.i[2] < (int)auVar198._8_4_) *
                               (int)auVar198._8_4_ |
                              (uint)(tray.tnear.field_0.i[2] >= (int)auVar198._8_4_) *
                              tray.tnear.field_0.i[2]) <=
                       (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar166) *
                               tray.tfar.field_0.i[2] |
                              (uint)(tray.tfar.field_0.i[2] >= (int)fVar166) * (int)fVar166);
              bVar33 = (float)((uint)(tray.tnear.field_0.i[3] < (int)auVar198._12_4_) *
                               (int)auVar198._12_4_ |
                              (uint)(tray.tnear.field_0.i[3] >= (int)auVar198._12_4_) *
                              tray.tnear.field_0.i[3]) <=
                       (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar152) *
                               tray.tfar.field_0.i[3] |
                              (uint)(tray.tfar.field_0.i[3] >= (int)fVar152) * (int)fVar152);
              if (uVar226 == 6) {
                fVar98 = *(float *)(uVar52 + 0xf0 + lVar58);
                fVar142 = *(float *)(uVar52 + 0x100 + lVar58);
                bVar67 = (fVar143 < fVar142 && fVar98 <= fVar143) && bVar67;
                bVar31 = (fVar154 < fVar142 && fVar98 <= fVar154) && bVar31;
                bVar32 = (fVar149 < fVar142 && fVar98 <= fVar149) && bVar32;
                bVar33 = (fVar151 < fVar142 && fVar98 <= fVar151) && bVar33;
              }
              auVar70._0_4_ = (-(uint)bVar67 & -(uint)(fVar214 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar70._4_4_ = (-(uint)bVar31 & -(uint)(fVar217 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar70._8_4_ = (-(uint)bVar32 & -(uint)(fVar220 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar70._12_4_ = (-(uint)bVar33 & -(uint)(fVar222 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar227 = movmskps((int)valid_i,auVar70);
              valid_i = (vint<4> *)(ulong)uVar227;
              sVar50 = root.ptr;
              aVar128 = aVar254;
              if ((uVar227 != 0) &&
                 (auVar127._4_4_ = iVar243, auVar127._0_4_ = iVar240, auVar127._8_4_ = iVar246,
                 auVar127._12_4_ = iVar249,
                 aVar128 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps(auVar127,auVar198,auVar70), sVar50 = sVar23, root.ptr != 8)) {
                pNVar65->ptr = root.ptr;
                pNVar65 = pNVar65 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar66->v = aVar254;
                paVar66 = paVar66 + 1;
              }
              root.ptr = sVar50;
              lVar58 = lVar58 + 4;
              aVar254 = aVar128;
            }
            if (root.ptr == 8) goto LAB_006dfba1;
            auVar71._4_4_ = -(uint)(aVar254.v[1] < tray.tfar.field_0.v[1]);
            auVar71._0_4_ = -(uint)(aVar254.v[0] < tray.tfar.field_0.v[0]);
            auVar71._8_4_ = -(uint)(aVar254.v[2] < tray.tfar.field_0.v[2]);
            auVar71._12_4_ = -(uint)(aVar254.v[3] < tray.tfar.field_0.v[3]);
            uVar51 = movmskps((int)uVar52,auVar71);
            uVar226 = POPCOUNT(uVar51);
          } while ((byte)uVar54 < (byte)uVar226);
          pNVar65->ptr = root.ptr;
          pNVar65 = pNVar65 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar66->v = aVar254;
          paVar66 = paVar66 + 1;
LAB_006dfba1:
          uVar226 = 4;
        }
        else {
          while (uVar52 != 0) {
            sVar23 = 0;
            if (uVar52 != 0) {
              for (; (uVar52 >> sVar23 & 1) == 0; sVar23 = sVar23 + 1) {
              }
            }
            uVar52 = uVar52 & uVar52 - 1;
            sVar56 = sVar23;
            valid_i = (vint<4> *)local_1a10;
            in_R9 = ray;
            bVar67 = occluded1(local_1a10,local_1a18,root,sVar23,&pre,ray,&tray,context);
            if (bVar67) {
              terminated.field_0.i[sVar23] = -1;
            }
          }
          uVar228 = movmskps((int)sVar56,(undefined1  [16])terminated.field_0);
          sVar56 = (size_t)uVar228;
          uVar226 = 3;
          iVar240 = 0x7f800000;
          iVar243 = 0x7f800000;
          iVar246 = 0x7f800000;
          iVar249 = 0x7f800000;
          if (uVar228 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            uVar226 = 2;
          }
          if (uVar54 < (uint)POPCOUNT(uVar227)) goto LAB_006df922;
        }
      } while (uVar226 != 3);
LAB_006e170b:
      auVar95._0_4_ = auVar101._0_4_ & terminated.field_0.i[0];
      auVar95._4_4_ = auVar101._4_4_ & terminated.field_0.i[1];
      auVar95._8_4_ = auVar101._8_4_ & terminated.field_0.i[2];
      auVar95._12_4_ = auVar101._12_4_ & terminated.field_0.i[3];
      auVar177 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar95);
      *(undefined1 (*) [16])(ray + 0x80) = auVar177;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }